

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined6 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  int iVar34;
  RTCFilterFunctionN p_Var35;
  RTCRayN *pRVar36;
  undefined1 *puVar37;
  byte bVar38;
  ulong uVar39;
  Geometry *pGVar40;
  Geometry *geometry;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  uint uVar54;
  undefined2 uVar86;
  float fVar87;
  float fVar91;
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  float fVar88;
  float fVar92;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar89;
  uint uVar90;
  float fVar93;
  uint uVar94;
  float fVar95;
  uint uVar96;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar97;
  float fVar98;
  float fVar110;
  float fVar112;
  vfloat4 v;
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar111;
  float fVar113;
  float fVar114;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar115;
  float fVar122;
  float fVar123;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar124;
  float fVar125;
  float fVar131;
  float fVar133;
  undefined1 auVar126 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar136;
  float fVar148;
  float fVar149;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  undefined8 uVar151;
  float fVar165;
  undefined1 auVar152 [16];
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined8 uVar166;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  undefined8 uVar168;
  float fVar173;
  float fVar174;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined8 uVar175;
  undefined1 auVar172 [16];
  float fVar176;
  float fVar177;
  float fVar197;
  float fVar198;
  undefined8 uVar178;
  float fVar199;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  float fVar196;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  undefined8 uVar202;
  undefined1 auVar195 [16];
  float fVar205;
  float fVar208;
  float fVar209;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar213;
  float fVar214;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar226;
  float fVar228;
  undefined1 auVar220 [16];
  float fVar230;
  undefined1 auVar223 [16];
  float fVar227;
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar240;
  float fVar243;
  float fVar246;
  undefined1 auVar236 [16];
  float fVar241;
  float fVar244;
  float fVar247;
  undefined1 auVar237 [16];
  float fVar242;
  float fVar245;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar252;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  bool local_509;
  float local_508;
  float fStack_504;
  float fStack_500;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float local_438;
  float fStack_434;
  float fStack_430;
  undefined1 local_428 [8];
  undefined8 uStack_420;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 *local_310;
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  LinearSpace3fa *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  uint local_218;
  int local_214;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  float local_1b8 [4];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 uVar85;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  
  PVar5 = prim[1];
  uVar42 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar42 * 0x19 + 6;
  fVar123 = *(float *)(pPVar4 + 0xc);
  fVar124 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar123;
  fVar131 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar123;
  fVar133 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar123;
  fVar115 = *(float *)(ray + k * 4 + 0x40) * fVar123;
  fVar122 = *(float *)(ray + k * 4 + 0x50) * fVar123;
  fVar123 = *(float *)(ray + k * 4 + 0x60) * fVar123;
  uVar6 = *(undefined4 *)(prim + uVar42 * 4 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar44;
  auVar158._12_2_ = uVar86;
  auVar158._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar44;
  auVar157._10_2_ = uVar86;
  auVar64._10_6_ = auVar157._10_6_;
  auVar64._8_2_ = uVar86;
  auVar64._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar15._4_8_ = auVar64._8_8_;
  auVar15._2_2_ = uVar86;
  auVar15._0_2_ = uVar86;
  fVar97 = (float)((int)sVar50 >> 8);
  fVar110 = (float)(auVar15._0_4_ >> 0x18);
  fVar112 = (float)(auVar64._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 * 5 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar44;
  auVar57._12_2_ = uVar86;
  auVar57._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar56._12_4_ = auVar57._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar44;
  auVar56._10_2_ = uVar86;
  auVar55._10_6_ = auVar56._10_6_;
  auVar55._8_2_ = uVar86;
  auVar55._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar16._4_8_ = auVar55._8_8_;
  auVar16._2_2_ = uVar86;
  auVar16._0_2_ = uVar86;
  fVar136 = (float)((int)sVar50 >> 8);
  fVar148 = (float)(auVar16._0_4_ >> 0x18);
  fVar149 = (float)(auVar55._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 * 6 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar44;
  auVar60._12_2_ = uVar86;
  auVar60._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar44;
  auVar59._10_2_ = uVar86;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar86;
  auVar58._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar17._4_8_ = auVar58._8_8_;
  auVar17._2_2_ = uVar86;
  auVar17._0_2_ = uVar86;
  fVar167 = (float)((int)sVar50 >> 8);
  fVar173 = (float)(auVar17._0_4_ >> 0x18);
  fVar174 = (float)(auVar58._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 * 0xb + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar44;
  auVar63._12_2_ = uVar86;
  auVar63._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar44;
  auVar62._10_2_ = uVar86;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar86;
  auVar61._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar18._4_8_ = auVar61._8_8_;
  auVar18._2_2_ = uVar86;
  auVar18._0_2_ = uVar86;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar87 = (float)(auVar18._0_4_ >> 0x18);
  fVar91 = (float)(auVar61._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar44;
  auVar154._12_2_ = uVar86;
  auVar154._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar44;
  auVar153._10_2_ = uVar86;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar86;
  auVar152._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar19._4_8_ = auVar152._8_8_;
  auVar19._2_2_ = uVar86;
  auVar19._0_2_ = uVar86;
  fVar150 = (float)((int)sVar50 >> 8);
  fVar164 = (float)(auVar19._0_4_ >> 0x18);
  fVar165 = (float)(auVar152._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar42 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar44;
  auVar181._12_2_ = uVar86;
  auVar181._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar44;
  auVar180._10_2_ = uVar86;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar86;
  auVar179._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar20._4_8_ = auVar179._8_8_;
  auVar20._2_2_ = uVar86;
  auVar20._0_2_ = uVar86;
  fVar210 = (float)((int)sVar50 >> 8);
  fVar213 = (float)(auVar20._0_4_ >> 0x18);
  fVar214 = (float)(auVar179._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar42 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar43 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar44;
  auVar184._12_2_ = uVar86;
  auVar184._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar44;
  auVar183._10_2_ = uVar86;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar86;
  auVar182._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar21._4_8_ = auVar182._8_8_;
  auVar21._2_2_ = uVar86;
  auVar21._0_2_ = uVar86;
  fVar205 = (float)((int)sVar50 >> 8);
  fVar208 = (float)(auVar21._0_4_ >> 0x18);
  fVar209 = (float)(auVar182._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar43 + uVar42 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar44;
  auVar187._12_2_ = uVar86;
  auVar187._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar44;
  auVar186._10_2_ = uVar86;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar86;
  auVar185._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar22._4_8_ = auVar185._8_8_;
  auVar22._2_2_ = uVar86;
  auVar22._0_2_ = uVar86;
  fVar215 = (float)((int)sVar50 >> 8);
  fVar216 = (float)(auVar22._0_4_ >> 0x18);
  fVar217 = (float)(auVar185._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar39 + 6);
  uVar85 = (undefined1)((uint)uVar6 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar6 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar6));
  uVar85 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar44 = CONCAT62(uVar14,sVar50);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar44;
  auVar222._12_2_ = uVar86;
  auVar222._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar44;
  auVar221._10_2_ = uVar86;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar86;
  auVar220._0_8_ = uVar44;
  uVar86 = (undefined2)uVar14;
  auVar23._4_8_ = auVar220._8_8_;
  auVar23._2_2_ = uVar86;
  auVar23._0_2_ = uVar86;
  fVar52 = (float)((int)sVar50 >> 8);
  fVar88 = (float)(auVar23._0_4_ >> 0x18);
  fVar92 = (float)(auVar220._8_4_ >> 0x18);
  fVar233 = fVar115 * fVar97 + fVar122 * fVar136 + fVar123 * fVar167;
  fVar240 = fVar115 * fVar110 + fVar122 * fVar148 + fVar123 * fVar173;
  fVar243 = fVar115 * fVar112 + fVar122 * fVar149 + fVar123 * fVar174;
  fVar246 = fVar115 * (float)(auVar157._12_4_ >> 0x18) +
            fVar122 * (float)(auVar56._12_4_ >> 0x18) + fVar123 * (float)(auVar59._12_4_ >> 0x18);
  fVar218 = fVar115 * fVar51 + fVar122 * fVar150 + fVar123 * fVar210;
  fVar226 = fVar115 * fVar87 + fVar122 * fVar164 + fVar123 * fVar213;
  fVar228 = fVar115 * fVar91 + fVar122 * fVar165 + fVar123 * fVar214;
  fVar230 = fVar115 * (float)(auVar62._12_4_ >> 0x18) +
            fVar122 * (float)(auVar153._12_4_ >> 0x18) + fVar123 * (float)(auVar180._12_4_ >> 0x18);
  fVar176 = fVar115 * fVar205 + fVar122 * fVar215 + fVar123 * fVar52;
  fVar196 = fVar115 * fVar208 + fVar122 * fVar216 + fVar123 * fVar88;
  fVar199 = fVar115 * fVar209 + fVar122 * fVar217 + fVar123 * fVar92;
  fVar115 = fVar115 * (float)(auVar183._12_4_ >> 0x18) +
            fVar122 * (float)(auVar186._12_4_ >> 0x18) + fVar123 * (float)(auVar221._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar136 = fVar97 * fVar124 + fVar136 * fVar131 + fVar167 * fVar133;
  fVar148 = fVar110 * fVar124 + fVar148 * fVar131 + fVar173 * fVar133;
  fVar149 = fVar112 * fVar124 + fVar149 * fVar131 + fVar174 * fVar133;
  fVar167 = (float)(auVar157._12_4_ >> 0x18) * fVar124 +
            (float)(auVar56._12_4_ >> 0x18) * fVar131 + (float)(auVar59._12_4_ >> 0x18) * fVar133;
  fVar173 = fVar51 * fVar124 + fVar150 * fVar131 + fVar210 * fVar133;
  fVar174 = fVar87 * fVar124 + fVar164 * fVar131 + fVar213 * fVar133;
  fVar210 = fVar91 * fVar124 + fVar165 * fVar131 + fVar214 * fVar133;
  fVar213 = (float)(auVar62._12_4_ >> 0x18) * fVar124 +
            (float)(auVar153._12_4_ >> 0x18) * fVar131 + (float)(auVar180._12_4_ >> 0x18) * fVar133;
  fVar150 = fVar124 * fVar205 + fVar131 * fVar215 + fVar133 * fVar52;
  fVar164 = fVar124 * fVar208 + fVar131 * fVar216 + fVar133 * fVar88;
  fVar165 = fVar124 * fVar209 + fVar131 * fVar217 + fVar133 * fVar92;
  fVar124 = fVar124 * (float)(auVar183._12_4_ >> 0x18) +
            fVar131 * (float)(auVar186._12_4_ >> 0x18) + fVar133 * (float)(auVar221._12_4_ >> 0x18);
  fVar123 = (float)DAT_01ff1d40;
  fVar51 = DAT_01ff1d40._4_4_;
  fVar52 = DAT_01ff1d40._8_4_;
  fVar87 = DAT_01ff1d40._12_4_;
  uVar46 = -(uint)(fVar123 <= ABS(fVar233));
  uVar47 = -(uint)(fVar51 <= ABS(fVar240));
  uVar48 = -(uint)(fVar52 <= ABS(fVar243));
  uVar49 = -(uint)(fVar87 <= ABS(fVar246));
  auVar236._0_4_ = (uint)fVar233 & uVar46;
  auVar236._4_4_ = (uint)fVar240 & uVar47;
  auVar236._8_4_ = (uint)fVar243 & uVar48;
  auVar236._12_4_ = (uint)fVar246 & uVar49;
  auVar137._0_4_ = ~uVar46 & (uint)fVar123;
  auVar137._4_4_ = ~uVar47 & (uint)fVar51;
  auVar137._8_4_ = ~uVar48 & (uint)fVar52;
  auVar137._12_4_ = ~uVar49 & (uint)fVar87;
  auVar137 = auVar137 | auVar236;
  uVar46 = -(uint)(fVar123 <= ABS(fVar218));
  uVar47 = -(uint)(fVar51 <= ABS(fVar226));
  uVar48 = -(uint)(fVar52 <= ABS(fVar228));
  uVar49 = -(uint)(fVar87 <= ABS(fVar230));
  auVar223._0_4_ = (uint)fVar218 & uVar46;
  auVar223._4_4_ = (uint)fVar226 & uVar47;
  auVar223._8_4_ = (uint)fVar228 & uVar48;
  auVar223._12_4_ = (uint)fVar230 & uVar49;
  auVar155._0_4_ = ~uVar46 & (uint)fVar123;
  auVar155._4_4_ = ~uVar47 & (uint)fVar51;
  auVar155._8_4_ = ~uVar48 & (uint)fVar52;
  auVar155._12_4_ = ~uVar49 & (uint)fVar87;
  auVar155 = auVar155 | auVar223;
  uVar46 = -(uint)(fVar123 <= ABS(fVar176));
  uVar47 = -(uint)(fVar51 <= ABS(fVar196));
  uVar48 = -(uint)(fVar52 <= ABS(fVar199));
  uVar49 = -(uint)(fVar87 <= ABS(fVar115));
  auVar188._0_4_ = (uint)fVar176 & uVar46;
  auVar188._4_4_ = (uint)fVar196 & uVar47;
  auVar188._8_4_ = (uint)fVar199 & uVar48;
  auVar188._12_4_ = (uint)fVar115 & uVar49;
  auVar169._0_4_ = ~uVar46 & (uint)fVar123;
  auVar169._4_4_ = ~uVar47 & (uint)fVar51;
  auVar169._8_4_ = ~uVar48 & (uint)fVar52;
  auVar169._12_4_ = ~uVar49 & (uint)fVar87;
  auVar169 = auVar169 | auVar188;
  auVar64 = rcpps(_DAT_01ff1d40,auVar137);
  fVar123 = auVar64._0_4_;
  fVar87 = auVar64._4_4_;
  fVar92 = auVar64._8_4_;
  fVar112 = auVar64._12_4_;
  fVar123 = (1.0 - auVar137._0_4_ * fVar123) * fVar123 + fVar123;
  fVar87 = (1.0 - auVar137._4_4_ * fVar87) * fVar87 + fVar87;
  fVar92 = (1.0 - auVar137._8_4_ * fVar92) * fVar92 + fVar92;
  fVar112 = (1.0 - auVar137._12_4_ * fVar112) * fVar112 + fVar112;
  auVar64 = rcpps(auVar64,auVar155);
  fVar51 = auVar64._0_4_;
  fVar88 = auVar64._4_4_;
  fVar97 = auVar64._8_4_;
  fVar115 = auVar64._12_4_;
  fVar51 = (1.0 - auVar155._0_4_ * fVar51) * fVar51 + fVar51;
  fVar88 = (1.0 - auVar155._4_4_ * fVar88) * fVar88 + fVar88;
  fVar97 = (1.0 - auVar155._8_4_ * fVar97) * fVar97 + fVar97;
  fVar115 = (1.0 - auVar155._12_4_ * fVar115) * fVar115 + fVar115;
  auVar64 = rcpps(auVar64,auVar169);
  fVar52 = auVar64._0_4_;
  fVar91 = auVar64._4_4_;
  fVar110 = auVar64._8_4_;
  fVar122 = auVar64._12_4_;
  fVar52 = (1.0 - auVar169._0_4_ * fVar52) * fVar52 + fVar52;
  fVar91 = (1.0 - auVar169._4_4_ * fVar91) * fVar91 + fVar91;
  fVar110 = (1.0 - auVar169._8_4_ * fVar110) * fVar110 + fVar110;
  fVar122 = (1.0 - auVar169._12_4_ * fVar122) * fVar122 + fVar122;
  uVar44 = *(ulong *)(prim + uVar42 * 7 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar44;
  auVar67._12_2_ = uVar86;
  auVar67._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar44;
  auVar66._10_2_ = uVar86;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar86;
  auVar65._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar24._4_8_ = auVar65._8_8_;
  auVar24._2_2_ = uVar86;
  auVar24._0_2_ = uVar86;
  auVar138._0_8_ =
       CONCAT44(((float)(auVar24._0_4_ >> 0x10) - fVar148) * fVar87,
                ((float)(int)(short)uVar44 - fVar136) * fVar123);
  auVar138._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar149) * fVar92;
  auVar138._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar167) * fVar112;
  uVar44 = *(ulong *)(prim + uVar42 * 9 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar44;
  auVar70._12_2_ = uVar86;
  auVar70._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar44;
  auVar69._10_2_ = uVar86;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar86;
  auVar68._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar25._4_8_ = auVar68._8_8_;
  auVar25._2_2_ = uVar86;
  auVar25._0_2_ = uVar86;
  auVar170._0_4_ = ((float)(int)(short)uVar44 - fVar136) * fVar123;
  auVar170._4_4_ = ((float)(auVar25._0_4_ >> 0x10) - fVar148) * fVar87;
  auVar170._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar149) * fVar92;
  auVar170._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar167) * fVar112;
  uVar44 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar42 * -2 + 6);
  uVar86 = (undefined2)(uVar43 >> 0x30);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar43;
  auVar101._12_2_ = uVar86;
  auVar101._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar43 >> 0x20);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar43;
  auVar100._10_2_ = uVar86;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = uVar86;
  auVar99._0_8_ = uVar43;
  uVar86 = (undefined2)(uVar43 >> 0x10);
  auVar26._4_8_ = auVar99._8_8_;
  auVar26._2_2_ = uVar86;
  auVar26._0_2_ = uVar86;
  auVar102._0_8_ =
       CONCAT44(((float)(auVar26._0_4_ >> 0x10) - fVar174) * fVar88,
                ((float)(int)(short)uVar43 - fVar173) * fVar51);
  auVar102._8_4_ = ((float)(auVar99._8_4_ >> 0x10) - fVar210) * fVar97;
  auVar102._12_4_ = ((float)(auVar100._12_4_ >> 0x10) - fVar213) * fVar115;
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar44;
  auVar73._12_2_ = uVar86;
  auVar73._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar44;
  auVar72._10_2_ = uVar86;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar86;
  auVar71._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar27._4_8_ = auVar71._8_8_;
  auVar27._2_2_ = uVar86;
  auVar27._0_2_ = uVar86;
  auVar206._0_4_ = ((float)(int)(short)uVar44 - fVar173) * fVar51;
  auVar206._4_4_ = ((float)(auVar27._0_4_ >> 0x10) - fVar174) * fVar88;
  auVar206._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar210) * fVar97;
  auVar206._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar213) * fVar115;
  uVar44 = *(ulong *)(prim + uVar39 + uVar42 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar44;
  auVar76._12_2_ = uVar86;
  auVar76._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar44;
  auVar75._10_2_ = uVar86;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar86;
  auVar74._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar28._4_8_ = auVar74._8_8_;
  auVar28._2_2_ = uVar86;
  auVar28._0_2_ = uVar86;
  auVar77._0_8_ =
       CONCAT44(((float)(auVar28._0_4_ >> 0x10) - fVar164) * fVar91,
                ((float)(int)(short)uVar44 - fVar150) * fVar52);
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar165) * fVar110;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar124) * fVar122;
  uVar44 = *(ulong *)(prim + uVar42 * 0x17 + 6);
  uVar86 = (undefined2)(uVar44 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar44;
  auVar191._12_2_ = uVar86;
  auVar191._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar44 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar44;
  auVar190._10_2_ = uVar86;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar86;
  auVar189._0_8_ = uVar44;
  uVar86 = (undefined2)(uVar44 >> 0x10);
  auVar29._4_8_ = auVar189._8_8_;
  auVar29._2_2_ = uVar86;
  auVar29._0_2_ = uVar86;
  auVar192._0_4_ = ((float)(int)(short)uVar44 - fVar150) * fVar52;
  auVar192._4_4_ = ((float)(auVar29._0_4_ >> 0x10) - fVar164) * fVar91;
  auVar192._8_4_ = ((float)(auVar189._8_4_ >> 0x10) - fVar165) * fVar110;
  auVar192._12_4_ = ((float)(auVar190._12_4_ >> 0x10) - fVar124) * fVar122;
  auVar156._8_4_ = auVar138._8_4_;
  auVar156._0_8_ = auVar138._0_8_;
  auVar156._12_4_ = auVar138._12_4_;
  auVar157 = minps(auVar156,auVar170);
  auVar116._8_4_ = auVar102._8_4_;
  auVar116._0_8_ = auVar102._0_8_;
  auVar116._12_4_ = auVar102._12_4_;
  auVar64 = minps(auVar116,auVar206);
  auVar157 = maxps(auVar157,auVar64);
  auVar117._8_4_ = auVar77._8_4_;
  auVar117._0_8_ = auVar77._0_8_;
  auVar117._12_4_ = auVar77._12_4_;
  auVar64 = minps(auVar117,auVar192);
  auVar126._4_4_ = uVar6;
  auVar126._0_4_ = uVar6;
  auVar126._8_4_ = uVar6;
  auVar126._12_4_ = uVar6;
  auVar64 = maxps(auVar64,auVar126);
  auVar158 = maxps(auVar157,auVar64);
  auVar157 = maxps(auVar138,auVar170);
  auVar64 = maxps(auVar102,auVar206);
  auVar157 = minps(auVar157,auVar64);
  auVar64 = maxps(auVar77,auVar192);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar103._4_4_ = uVar6;
  auVar103._0_4_ = uVar6;
  auVar103._8_4_ = uVar6;
  auVar103._12_4_ = uVar6;
  auVar64 = minps(auVar64,auVar103);
  local_48 = auVar158._0_4_ * 0.99999964;
  fStack_44 = auVar158._4_4_ * 0.99999964;
  fStack_40 = auVar158._8_4_ * 0.99999964;
  fStack_3c = auVar158._12_4_ * 0.99999964;
  auVar64 = minps(auVar157,auVar64);
  auVar78._0_4_ = -(uint)(local_48 <= auVar64._0_4_ * 1.0000004 && PVar5 != (Primitive)0x0);
  auVar78._4_4_ = -(uint)(fStack_44 <= auVar64._4_4_ * 1.0000004 && 1 < (byte)PVar5);
  auVar78._8_4_ = -(uint)(fStack_40 <= auVar64._8_4_ * 1.0000004 && 2 < (byte)PVar5);
  auVar78._12_4_ = -(uint)(fStack_3c <= auVar64._12_4_ * 1.0000004 && 3 < (byte)PVar5);
  uVar46 = movmskps((uint)(byte)PVar5,auVar78);
  local_509 = uVar46 != 0;
  if (local_509) {
    uVar46 = uVar46 & 0xff;
    local_250 = pre->ray_space + k;
    local_398 = mm_lookupmask_ps._0_8_;
    uStack_390 = mm_lookupmask_ps._8_8_;
    local_310 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar44 = (ulong)uVar46;
      lVar10 = 0;
      if (uVar44 != 0) {
        for (; (uVar46 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar44 = uVar44 - 1 & uVar44;
      local_428._4_4_ = *(undefined4 *)(prim + 2);
      local_3a0 = (ulong)(uint)local_428._4_4_;
      uStack_3e0._0_4_ = *(uint *)(prim + lVar10 * 4 + 6);
      pGVar8 = (context->scene->geometries).items[local_3a0].ptr;
      _Var9 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_2c8._0_8_ = CONCAT44(0,(uint)uStack_3e0);
      uVar43 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 + _Var9 * CONCAT44(0,(uint)uStack_3e0))
      ;
      pGVar40 = (Geometry *)pGVar8[1].intersectionFilterN;
      lVar10 = *(long *)&pGVar8[1].time_range.upper;
      pfVar1 = (float *)(lVar10 + (long)pGVar40 * uVar43);
      local_338 = *pfVar1;
      fStack_334 = pfVar1[1];
      local_208 = *(undefined8 *)pfVar1;
      fStack_330 = pfVar1[2];
      fStack_32c = pfVar1[3];
      uStack_200 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar10 + (uVar43 + 1) * (long)pGVar40);
      local_348 = *pfVar1;
      fStack_344 = pfVar1[1];
      fStack_340 = pfVar1[2];
      fStack_33c = pfVar1[3];
      pfVar2 = (float *)(lVar10 + (uVar43 + 2) * (long)pGVar40);
      local_378 = *pfVar2;
      fStack_374 = pfVar2[1];
      fStack_370 = pfVar2[2];
      fStack_36c = pfVar2[3];
      lVar41 = 0;
      if (uVar44 != 0) {
        for (; (uVar44 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
        }
      }
      pfVar3 = (float *)(lVar10 + (uVar43 + 3) * (long)pGVar40);
      local_388 = *pfVar3;
      fStack_384 = pfVar3[1];
      fStack_380 = pfVar3[2];
      fStack_37c = pfVar3[3];
      if ((uVar44 != 0) && (uVar43 = uVar44 - 1 & uVar44, uVar43 != 0)) {
        lVar10 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        pGVar40 = (Geometry *)
                  ((long)pGVar40 *
                  (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                                  _Var9 * *(uint *)(prim + lVar10 * 4 + 6)));
      }
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar123 = *(float *)(ray + k * 4);
      fVar51 = *(float *)(ray + k * 4 + 0x10);
      fVar52 = *(float *)(ray + k * 4 + 0x20);
      fVar136 = local_338 - fVar123;
      fVar148 = fStack_334 - fVar51;
      fVar149 = fStack_330 - fVar52;
      fVar87 = (local_250->vx).field_0.m128[0];
      fVar88 = (local_250->vx).field_0.m128[1];
      fVar91 = (local_250->vx).field_0.m128[2];
      fVar92 = (local_250->vy).field_0.m128[0];
      fVar97 = (local_250->vy).field_0.m128[1];
      fVar110 = (local_250->vy).field_0.m128[2];
      fVar112 = (local_250->vz).field_0.m128[0];
      fVar115 = (local_250->vz).field_0.m128[1];
      fVar122 = (local_250->vz).field_0.m128[2];
      local_2a8 = fVar136 * fVar87 + fVar148 * fVar92 + fVar149 * fVar112;
      local_268 = fVar136 * fVar88 + fVar148 * fVar97 + fVar149 * fVar115;
      fVar164 = fVar136 * fVar91 + fVar148 * fVar110 + fVar149 * fVar122;
      fVar136 = local_348 - fVar123;
      fVar148 = fStack_344 - fVar51;
      fVar149 = fStack_340 - fVar52;
      fVar167 = fVar136 * fVar87 + fVar148 * fVar92 + fVar149 * fVar112;
      fVar150 = fVar136 * fVar88 + fVar148 * fVar97 + fVar149 * fVar115;
      local_328 = fVar136 * fVar91 + fVar148 * fVar110 + fVar149 * fVar122;
      fVar136 = local_378 - fVar123;
      fVar148 = fStack_374 - fVar51;
      fVar149 = fStack_370 - fVar52;
      fVar165 = fVar136 * fVar87 + fVar148 * fVar92 + fVar149 * fVar112;
      local_368 = fVar136 * fVar88 + fVar148 * fVar97 + fVar149 * fVar115;
      fVar136 = fVar136 * fVar91 + fVar148 * fVar110 + fVar149 * fVar122;
      fVar123 = local_388 - fVar123;
      fVar51 = fStack_384 - fVar51;
      fVar52 = fStack_380 - fVar52;
      fVar87 = fVar123 * fVar87 + fVar51 * fVar92 + fVar52 * fVar112;
      fVar88 = fVar123 * fVar88 + fVar51 * fVar97 + fVar52 * fVar115;
      fVar51 = fVar123 * fVar91 + fVar51 * fVar110 + fVar52 * fVar122;
      auVar193._0_8_ = CONCAT44(local_268,local_2a8) & 0x7fffffff7fffffff;
      auVar193._8_4_ = ABS(fVar164);
      auVar193._12_4_ = ABS(fStack_32c);
      auVar139._0_8_ = CONCAT44(fVar150,fVar167) & 0x7fffffff7fffffff;
      auVar139._8_4_ = ABS(local_328);
      auVar139._12_4_ = ABS(fStack_33c);
      auVar157 = maxps(auVar193,auVar139);
      auVar159._0_8_ = CONCAT44(local_368,fVar165) & 0x7fffffff7fffffff;
      auVar159._8_4_ = ABS(fVar136);
      auVar159._12_4_ = ABS(fStack_36c);
      auVar104._0_8_ = CONCAT44(fVar88,fVar87) & 0x7fffffff7fffffff;
      auVar104._8_4_ = ABS(fVar51);
      auVar104._12_4_ = ABS(fStack_37c);
      auVar64 = maxps(auVar159,auVar104);
      auVar64 = maxps(auVar157,auVar64);
      fVar123 = auVar64._4_4_;
      if (auVar64._4_4_ <= auVar64._0_4_) {
        fVar123 = auVar64._0_4_;
      }
      auVar194._8_8_ = auVar64._8_8_;
      auVar194._0_8_ = auVar64._8_8_;
      fVar52 = (float)iVar7;
      _local_2d8 = ZEXT416((uint)fVar52);
      if (auVar64._8_4_ <= fVar123) {
        auVar194._0_4_ = fVar123;
      }
      lVar10 = (long)iVar7 * 0x44;
      fVar91 = *(float *)(catmullrom_basis0 + lVar10 + 0x908);
      fVar92 = *(float *)(catmullrom_basis0 + lVar10 + 0x90c);
      fVar97 = *(float *)(catmullrom_basis0 + lVar10 + 0x910);
      fVar110 = *(float *)(catmullrom_basis0 + lVar10 + 0x914);
      fVar123 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar10 + 0xd8c);
      fVar112 = *(float *)(catmullrom_basis0 + lVar10 + 0xd90);
      fVar115 = *(float *)(catmullrom_basis0 + lVar10 + 0xd94);
      auVar15 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar10 + 0xd8c);
      fVar122 = *(float *)(catmullrom_basis0 + lVar10 + 0xd98);
      fVar148 = *(float *)(catmullrom_basis0 + lVar10 + 0x484);
      fVar149 = *(float *)(catmullrom_basis0 + lVar10 + 0x488);
      fVar124 = *(float *)(catmullrom_basis0 + lVar10 + 0x48c);
      fVar131 = *(float *)(catmullrom_basis0 + lVar10 + 0x490);
      local_278 = *(float *)(catmullrom_basis0 + lVar10);
      fStack_274 = *(float *)(catmullrom_basis0 + lVar10 + 4);
      fStack_270 = *(float *)(catmullrom_basis0 + lVar10 + 8);
      fStack_26c = *(float *)(catmullrom_basis0 + lVar10 + 0xc);
      fVar234 = local_2a8 * local_278 + fVar167 * fVar148 + fVar165 * fVar91 + fVar87 * fVar123;
      fVar241 = local_2a8 * fStack_274 + fVar167 * fVar149 + fVar165 * fVar92 + fVar87 * fVar112;
      fVar244 = local_2a8 * fStack_270 + fVar167 * fVar124 + fVar165 * fVar97 + fVar87 * fVar115;
      fVar247 = local_2a8 * fStack_26c + fVar167 * fVar131 + fVar165 * fVar110 + fVar87 * fVar122;
      fVar259 = local_268 * local_278 + fVar150 * fVar148 + local_368 * fVar91 + fVar88 * fVar123;
      fVar261 = local_268 * fStack_274 + fVar150 * fVar149 + local_368 * fVar92 + fVar88 * fVar112;
      fVar265 = local_268 * fStack_270 + fVar150 * fVar124 + local_368 * fVar97 + fVar88 * fVar115;
      fVar269 = local_268 * fStack_26c + fVar150 * fVar131 + local_368 * fVar110 + fVar88 * fVar122;
      auVar118._0_4_ =
           fStack_32c * local_278 +
           fStack_33c * fVar148 + fStack_36c * fVar91 + fStack_37c * fVar123;
      auVar118._4_4_ =
           fStack_32c * fStack_274 +
           fStack_33c * fVar149 + fStack_36c * fVar92 + fStack_37c * fVar112;
      auVar118._8_4_ =
           fStack_32c * fStack_270 +
           fStack_33c * fVar124 + fStack_36c * fVar97 + fStack_37c * fVar115;
      auVar118._12_4_ =
           fStack_32c * fStack_26c +
           fStack_33c * fVar131 + fStack_36c * fVar110 + fStack_37c * fVar122;
      fVar112 = *(float *)(catmullrom_basis1 + lVar10 + 0xd8c);
      fVar115 = *(float *)(catmullrom_basis1 + lVar10 + 0xd90);
      fVar133 = *(float *)(catmullrom_basis1 + lVar10 + 0xd94);
      fVar173 = *(float *)(catmullrom_basis1 + lVar10 + 0xd98);
      fVar174 = *(float *)(catmullrom_basis1 + lVar10 + 0x908);
      fVar176 = *(float *)(catmullrom_basis1 + lVar10 + 0x90c);
      fVar196 = *(float *)(catmullrom_basis1 + lVar10 + 0x910);
      fVar199 = *(float *)(catmullrom_basis1 + lVar10 + 0x914);
      local_68 = fStack_37c;
      fStack_64 = fStack_37c;
      fStack_60 = fStack_37c;
      fStack_5c = fStack_37c;
      local_58 = fStack_36c;
      fStack_54 = fStack_36c;
      fStack_50 = fStack_36c;
      fStack_4c = fStack_36c;
      fVar205 = *(float *)(catmullrom_basis1 + lVar10 + 0x484);
      fVar208 = *(float *)(catmullrom_basis1 + lVar10 + 0x488);
      fVar209 = *(float *)(catmullrom_basis1 + lVar10 + 0x48c);
      fVar210 = *(float *)(catmullrom_basis1 + lVar10 + 0x490);
      local_158 = fStack_33c;
      fStack_154 = fStack_33c;
      fStack_150 = fStack_33c;
      fStack_14c = fStack_33c;
      fVar213 = *(float *)(catmullrom_basis1 + lVar10);
      fVar214 = *(float *)(catmullrom_basis1 + lVar10 + 4);
      fVar215 = *(float *)(catmullrom_basis1 + lVar10 + 8);
      fVar216 = *(float *)(catmullrom_basis1 + lVar10 + 0xc);
      fVar246 = local_2a8 * fVar213 + fVar167 * fVar205 + fVar165 * fVar174 + fVar87 * fVar112;
      fVar197 = local_2a8 * fVar214 + fVar167 * fVar208 + fVar165 * fVar176 + fVar87 * fVar115;
      fVar200 = local_2a8 * fVar215 + fVar167 * fVar209 + fVar165 * fVar196 + fVar87 * fVar133;
      fVar203 = local_2a8 * fVar216 + fVar167 * fVar210 + fVar165 * fVar199 + fVar87 * fVar173;
      fVar217 = local_268 * fVar213 + fVar150 * fVar205 + local_368 * fVar174 + fVar88 * fVar112;
      fVar218 = local_268 * fVar214 + fVar150 * fVar208 + local_368 * fVar176 + fVar88 * fVar115;
      fVar226 = local_268 * fVar215 + fVar150 * fVar209 + local_368 * fVar196 + fVar88 * fVar133;
      fVar228 = local_268 * fVar216 + fVar150 * fVar210 + local_368 * fVar199 + fVar88 * fVar173;
      local_168 = fStack_32c;
      fStack_164 = fStack_32c;
      fStack_160 = fStack_32c;
      fStack_15c = fStack_32c;
      auVar211._0_4_ =
           fStack_32c * fVar213 + fStack_33c * fVar205 + fStack_36c * fVar174 + fStack_37c * fVar112
      ;
      auVar211._4_4_ =
           fStack_32c * fVar214 + fStack_33c * fVar208 + fStack_36c * fVar176 + fStack_37c * fVar115
      ;
      auVar211._8_4_ =
           fStack_32c * fVar215 + fStack_33c * fVar209 + fStack_36c * fVar196 + fStack_37c * fVar133
      ;
      auVar211._12_4_ =
           fStack_32c * fVar216 + fStack_33c * fVar210 + fStack_36c * fVar199 + fStack_37c * fVar173
      ;
      fVar177 = fVar246 - fVar234;
      fVar198 = fVar197 - fVar241;
      fVar201 = fVar200 - fVar244;
      fVar204 = fVar203 - fVar247;
      fVar230 = fVar217 - fVar259;
      fVar233 = fVar218 - fVar261;
      fVar240 = fVar226 - fVar265;
      fVar243 = fVar228 - fVar269;
      fVar123 = fVar259 * fVar177 - fVar234 * fVar230;
      fVar262 = fVar261 * fVar198 - fVar241 * fVar233;
      fVar266 = fVar265 * fVar201 - fVar244 * fVar240;
      fVar270 = fVar269 * fVar204 - fVar247 * fVar243;
      auVar64 = maxps(auVar118,auVar211);
      bVar45 = fVar123 * fVar123 <=
               auVar64._0_4_ * auVar64._0_4_ * (fVar177 * fVar177 + fVar230 * fVar230) &&
               0.0 < fVar52;
      bVar30 = fVar262 * fVar262 <=
               auVar64._4_4_ * auVar64._4_4_ * (fVar198 * fVar198 + fVar233 * fVar233) &&
               1.0 < fVar52;
      bVar31 = fVar266 * fVar266 <=
               auVar64._8_4_ * auVar64._8_4_ * (fVar201 * fVar201 + fVar240 * fVar240) &&
               2.0 < fVar52;
      bVar32 = fVar270 * fVar270 <=
               auVar64._12_4_ * auVar64._12_4_ * (fVar204 * fVar204 + fVar243 * fVar243) &&
               3.0 < fVar52;
      local_358 = auVar194._0_4_;
      fStack_354 = auVar194._4_4_;
      fStack_350 = auVar194._8_4_;
      fStack_34c = auVar194._12_4_;
      local_358 = local_358 * 4.7683716e-07;
      auVar11._4_4_ = -(uint)bVar30;
      auVar11._0_4_ = -(uint)bVar45;
      auVar11._8_4_ = -(uint)bVar31;
      auVar11._12_4_ = -(uint)bVar32;
      iVar34 = movmskps(iVar7,auVar11);
      fVar123 = *(float *)(ray + k * 4 + 0x30);
      _local_2b8 = ZEXT416((uint)fVar123);
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      if (iVar34 == 0) {
        bVar45 = false;
        uVar46 = 0;
      }
      else {
        fVar53 = fVar112 * fVar51 + fVar174 * fVar136 + fVar205 * local_328 + fVar213 * fVar164;
        fVar89 = fVar115 * fVar51 + fVar176 * fVar136 + fVar208 * local_328 + fVar214 * fVar164;
        fVar93 = fVar133 * fVar51 + fVar196 * fVar136 + fVar209 * local_328 + fVar215 * fVar164;
        fVar95 = fVar173 * fVar51 + fVar199 * fVar136 + fVar210 * local_328 + fVar216 * fVar164;
        local_508 = auVar15._0_4_;
        fStack_504 = auVar15._4_4_;
        fStack_500 = auVar15._8_4_;
        fVar125 = local_508 * fVar51 + fVar91 * fVar136 + fVar148 * local_328 + local_278 * fVar164;
        fVar132 = fStack_504 * fVar51 + fVar92 * fVar136 + fVar149 * local_328 +
                  fStack_274 * fVar164;
        fVar134 = fStack_500 * fVar51 + fVar97 * fVar136 + fVar124 * local_328 +
                  fStack_270 * fVar164;
        fVar135 = fVar122 * fVar51 + fVar110 * fVar136 + fVar131 * local_328 + fStack_26c * fVar164;
        fVar91 = *(float *)(catmullrom_basis0 + lVar10 + 0x1210);
        fVar92 = *(float *)(catmullrom_basis0 + lVar10 + 0x1214);
        fVar97 = *(float *)(catmullrom_basis0 + lVar10 + 0x1218);
        fVar110 = *(float *)(catmullrom_basis0 + lVar10 + 0x121c);
        fVar112 = *(float *)(catmullrom_basis0 + lVar10 + 0x1694);
        fVar115 = *(float *)(catmullrom_basis0 + lVar10 + 0x1698);
        fVar122 = *(float *)(catmullrom_basis0 + lVar10 + 0x169c);
        fVar148 = *(float *)(catmullrom_basis0 + lVar10 + 0x16a0);
        fVar149 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b18);
        fVar124 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b1c);
        fVar131 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b20);
        fVar133 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b24);
        fVar173 = *(float *)(catmullrom_basis0 + lVar10 + 0x1f9c);
        fVar174 = *(float *)(catmullrom_basis0 + lVar10 + 0x1fa0);
        fVar176 = *(float *)(catmullrom_basis0 + lVar10 + 0x1fa4);
        fVar196 = *(float *)(catmullrom_basis0 + lVar10 + 0x1fa8);
        fVar219 = local_2a8 * fVar91 + fVar167 * fVar112 + fVar165 * fVar149 + fVar87 * fVar173;
        fVar227 = local_2a8 * fVar92 + fVar167 * fVar115 + fVar165 * fVar124 + fVar87 * fVar174;
        fVar229 = local_2a8 * fVar97 + fVar167 * fVar122 + fVar165 * fVar131 + fVar87 * fVar176;
        fVar231 = local_2a8 * fVar110 + fVar167 * fVar148 + fVar165 * fVar133 + fVar87 * fVar196;
        fVar260 = local_268 * fVar91 + fVar150 * fVar112 + local_368 * fVar149 + fVar88 * fVar173;
        fVar263 = local_268 * fVar92 + fVar150 * fVar115 + local_368 * fVar124 + fVar88 * fVar174;
        fVar267 = local_268 * fVar97 + fVar150 * fVar122 + local_368 * fVar131 + fVar88 * fVar176;
        fVar271 = local_268 * fVar110 + fVar150 * fVar148 + local_368 * fVar133 + fVar88 * fVar196;
        fVar199 = *(float *)(catmullrom_basis1 + lVar10 + 0x1210);
        fVar205 = *(float *)(catmullrom_basis1 + lVar10 + 0x1214);
        fVar208 = *(float *)(catmullrom_basis1 + lVar10 + 0x1218);
        fVar209 = *(float *)(catmullrom_basis1 + lVar10 + 0x121c);
        fVar210 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b18);
        fVar213 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b1c);
        fVar214 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b20);
        fVar215 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b24);
        fVar216 = *(float *)(catmullrom_basis1 + lVar10 + 0x1f9c);
        fVar262 = *(float *)(catmullrom_basis1 + lVar10 + 0x1fa0);
        fVar266 = *(float *)(catmullrom_basis1 + lVar10 + 0x1fa4);
        fVar270 = *(float *)(catmullrom_basis1 + lVar10 + 0x1fa8);
        fVar232 = *(float *)(catmullrom_basis1 + lVar10 + 0x1694);
        fVar235 = *(float *)(catmullrom_basis1 + lVar10 + 0x1698);
        fVar242 = *(float *)(catmullrom_basis1 + lVar10 + 0x169c);
        fVar245 = *(float *)(catmullrom_basis1 + lVar10 + 0x16a0);
        fVar252 = local_2a8 * fVar199 + fVar167 * fVar232 + fVar165 * fVar210 + fVar87 * fVar216;
        fVar256 = local_2a8 * fVar205 + fVar167 * fVar235 + fVar165 * fVar213 + fVar87 * fVar262;
        fVar257 = local_2a8 * fVar208 + fVar167 * fVar242 + fVar165 * fVar214 + fVar87 * fVar266;
        fVar258 = local_2a8 * fVar209 + fVar167 * fVar245 + fVar165 * fVar215 + fVar87 * fVar270;
        fVar98 = local_268 * fVar199 + fVar150 * fVar232 + local_368 * fVar210 + fVar88 * fVar216;
        fVar111 = local_268 * fVar205 + fVar150 * fVar235 + local_368 * fVar213 + fVar88 * fVar262;
        fVar113 = local_268 * fVar208 + fVar150 * fVar242 + local_368 * fVar214 + fVar88 * fVar266;
        fVar114 = local_268 * fVar209 + fVar150 * fVar245 + local_368 * fVar215 + fVar88 * fVar270;
        uVar54 = (uint)DAT_01fec6c0;
        uVar90 = DAT_01fec6c0._4_4_;
        uVar94 = DAT_01fec6c0._8_4_;
        uVar96 = DAT_01fec6c0._12_4_;
        auVar237._0_4_ = (uint)fVar219 & uVar54;
        auVar237._4_4_ = (uint)fVar227 & uVar90;
        auVar237._8_4_ = (uint)fVar229 & uVar94;
        auVar237._12_4_ = (uint)fVar231 & uVar96;
        auVar207._0_4_ = (uint)fVar260 & uVar54;
        auVar207._4_4_ = (uint)fVar263 & uVar90;
        auVar207._8_4_ = (uint)fVar267 & uVar94;
        auVar207._12_4_ = (uint)fVar271 & uVar96;
        auVar64 = maxps(auVar237,auVar207);
        auVar248._0_4_ =
             (uint)(fVar91 * fVar164 + fVar112 * local_328 + fVar149 * fVar136 + fVar173 * fVar51) &
             uVar54;
        auVar248._4_4_ =
             (uint)(fVar92 * fVar164 + fVar115 * local_328 + fVar124 * fVar136 + fVar174 * fVar51) &
             uVar90;
        auVar248._8_4_ =
             (uint)(fVar97 * fVar164 + fVar122 * local_328 + fVar131 * fVar136 + fVar176 * fVar51) &
             uVar94;
        auVar248._12_4_ =
             (uint)(fVar110 * fVar164 + fVar148 * local_328 + fVar133 * fVar136 + fVar196 * fVar51)
             & uVar96;
        auVar64 = maxps(auVar64,auVar248);
        uVar46 = -(uint)(local_358 <= auVar64._0_4_);
        uVar47 = -(uint)(local_358 <= auVar64._4_4_);
        uVar48 = -(uint)(local_358 <= auVar64._8_4_);
        uVar49 = -(uint)(local_358 <= auVar64._12_4_);
        fVar115 = (float)((uint)fVar219 & uVar46 | ~uVar46 & (uint)fVar177);
        fVar148 = (float)((uint)fVar227 & uVar47 | ~uVar47 & (uint)fVar198);
        fVar149 = (float)((uint)fVar229 & uVar48 | ~uVar48 & (uint)fVar201);
        fVar124 = (float)((uint)fVar231 & uVar49 | ~uVar49 & (uint)fVar204);
        fVar131 = (float)(~uVar46 & (uint)fVar230 | (uint)fVar260 & uVar46);
        fVar133 = (float)(~uVar47 & (uint)fVar233 | (uint)fVar263 & uVar47);
        fVar173 = (float)(~uVar48 & (uint)fVar240 | (uint)fVar267 & uVar48);
        fVar174 = (float)(~uVar49 & (uint)fVar243 | (uint)fVar271 & uVar49);
        auVar249._0_4_ = (uint)fVar252 & uVar54;
        auVar249._4_4_ = (uint)fVar256 & uVar90;
        auVar249._8_4_ = (uint)fVar257 & uVar94;
        auVar249._12_4_ = (uint)fVar258 & uVar96;
        auVar212._0_4_ = (uint)fVar98 & uVar54;
        auVar212._4_4_ = (uint)fVar111 & uVar90;
        auVar212._8_4_ = (uint)fVar113 & uVar94;
        auVar212._12_4_ = (uint)fVar114 & uVar96;
        auVar64 = maxps(auVar249,auVar212);
        auVar171._0_4_ =
             (uint)(fVar199 * fVar164 + fVar232 * local_328 + fVar210 * fVar136 + fVar216 * fVar51)
             & uVar54;
        auVar171._4_4_ =
             (uint)(fVar205 * fVar164 + fVar235 * local_328 + fVar213 * fVar136 + fVar262 * fVar51)
             & uVar90;
        auVar171._8_4_ =
             (uint)(fVar208 * fVar164 + fVar242 * local_328 + fVar214 * fVar136 + fVar266 * fVar51)
             & uVar94;
        auVar171._12_4_ =
             (uint)(fVar209 * fVar164 + fVar245 * local_328 + fVar215 * fVar136 + fVar270 * fVar51)
             & uVar96;
        auVar64 = maxps(auVar64,auVar171);
        uVar46 = -(uint)(local_358 <= auVar64._0_4_);
        uVar47 = -(uint)(local_358 <= auVar64._4_4_);
        uVar48 = -(uint)(local_358 <= auVar64._8_4_);
        uVar49 = -(uint)(local_358 <= auVar64._12_4_);
        fVar208 = (float)((uint)fVar252 & uVar46 | ~uVar46 & (uint)fVar177);
        fVar209 = (float)((uint)fVar256 & uVar47 | ~uVar47 & (uint)fVar198);
        fVar210 = (float)((uint)fVar257 & uVar48 | ~uVar48 & (uint)fVar201);
        fVar214 = (float)((uint)fVar258 & uVar49 | ~uVar49 & (uint)fVar204);
        fVar176 = (float)(~uVar46 & (uint)fVar230 | (uint)fVar98 & uVar46);
        fVar196 = (float)(~uVar47 & (uint)fVar233 | (uint)fVar111 & uVar47);
        fVar199 = (float)(~uVar48 & (uint)fVar240 | (uint)fVar113 & uVar48);
        fVar205 = (float)(~uVar49 & (uint)fVar243 | (uint)fVar114 & uVar49);
        auVar105._0_4_ = fVar131 * fVar131 + fVar115 * fVar115;
        auVar105._4_4_ = fVar133 * fVar133 + fVar148 * fVar148;
        auVar105._8_4_ = fVar173 * fVar173 + fVar149 * fVar149;
        auVar105._12_4_ = fVar174 * fVar174 + fVar124 * fVar124;
        auVar64 = rsqrtps(_DAT_01fec6c0,auVar105);
        fVar91 = auVar64._0_4_;
        fVar92 = auVar64._4_4_;
        fVar97 = auVar64._8_4_;
        fVar110 = auVar64._12_4_;
        auVar140._0_4_ = fVar91 * fVar91 * auVar105._0_4_ * 0.5 * fVar91;
        auVar140._4_4_ = fVar92 * fVar92 * auVar105._4_4_ * 0.5 * fVar92;
        auVar140._8_4_ = fVar97 * fVar97 * auVar105._8_4_ * 0.5 * fVar97;
        auVar140._12_4_ = fVar110 * fVar110 * auVar105._12_4_ * 0.5 * fVar110;
        fVar213 = fVar91 * 1.5 - auVar140._0_4_;
        fVar215 = fVar92 * 1.5 - auVar140._4_4_;
        fVar230 = fVar97 * 1.5 - auVar140._8_4_;
        fVar177 = fVar110 * 1.5 - auVar140._12_4_;
        auVar106._0_4_ = fVar176 * fVar176 + fVar208 * fVar208;
        auVar106._4_4_ = fVar196 * fVar196 + fVar209 * fVar209;
        auVar106._8_4_ = fVar199 * fVar199 + fVar210 * fVar210;
        auVar106._12_4_ = fVar205 * fVar205 + fVar214 * fVar214;
        auVar64 = rsqrtps(auVar140,auVar106);
        fVar91 = auVar64._0_4_;
        fVar92 = auVar64._4_4_;
        fVar97 = auVar64._8_4_;
        fVar110 = auVar64._12_4_;
        fVar91 = fVar91 * 1.5 - fVar91 * fVar91 * auVar106._0_4_ * 0.5 * fVar91;
        fVar112 = fVar92 * 1.5 - fVar92 * fVar92 * auVar106._4_4_ * 0.5 * fVar92;
        fVar97 = fVar97 * 1.5 - fVar97 * fVar97 * auVar106._8_4_ * 0.5 * fVar97;
        fVar122 = fVar110 * 1.5 - fVar110 * fVar110 * auVar106._12_4_ * 0.5 * fVar110;
        fVar216 = fVar131 * fVar213 * auVar118._0_4_;
        fVar233 = fVar133 * fVar215 * auVar118._4_4_;
        fVar240 = fVar173 * fVar230 * auVar118._8_4_;
        fVar243 = fVar174 * fVar177 * auVar118._12_4_;
        fVar92 = -fVar115 * fVar213 * auVar118._0_4_;
        fVar110 = -fVar148 * fVar215 * auVar118._4_4_;
        fVar115 = -fVar149 * fVar230 * auVar118._8_4_;
        fVar148 = -fVar124 * fVar177 * auVar118._12_4_;
        fVar219 = fVar213 * 0.0 * auVar118._0_4_;
        fVar227 = fVar215 * 0.0 * auVar118._4_4_;
        fVar229 = fVar230 * 0.0 * auVar118._8_4_;
        fVar231 = fVar177 * 0.0 * auVar118._12_4_;
        fVar230 = fVar176 * fVar91 * auVar211._0_4_;
        fVar111 = fVar196 * fVar112 * auVar211._4_4_;
        fVar113 = fVar199 * fVar97 * auVar211._8_4_;
        fVar114 = fVar205 * fVar122 * auVar211._12_4_;
        fVar177 = fVar246 + fVar230;
        fVar198 = fVar197 + fVar111;
        fVar201 = fVar200 + fVar113;
        fVar204 = fVar203 + fVar114;
        fVar205 = -fVar208 * fVar91 * auVar211._0_4_;
        fVar209 = -fVar209 * fVar112 * auVar211._4_4_;
        fVar213 = -fVar210 * fVar97 * auVar211._8_4_;
        fVar215 = -fVar214 * fVar122 * auVar211._12_4_;
        fVar262 = fVar217 + fVar205;
        fVar266 = fVar218 + fVar209;
        fVar270 = fVar226 + fVar213;
        fVar232 = fVar228 + fVar215;
        fVar124 = fVar91 * 0.0 * auVar211._0_4_;
        fVar133 = fVar112 * 0.0 * auVar211._4_4_;
        fVar174 = fVar97 * 0.0 * auVar211._8_4_;
        fVar196 = fVar122 * 0.0 * auVar211._12_4_;
        fVar149 = fVar234 - fVar216;
        fVar131 = fVar241 - fVar233;
        fVar173 = fVar244 - fVar240;
        fVar176 = fVar247 - fVar243;
        fVar235 = fVar53 + fVar124;
        fVar242 = fVar89 + fVar133;
        fVar245 = fVar93 + fVar174;
        fVar98 = fVar95 + fVar196;
        fVar91 = fVar259 - fVar92;
        fVar97 = fVar261 - fVar110;
        fVar112 = fVar265 - fVar115;
        fVar122 = fVar269 - fVar148;
        fVar199 = fVar125 - fVar219;
        fVar208 = fVar132 - fVar227;
        fVar210 = fVar134 - fVar229;
        fVar214 = fVar135 - fVar231;
        uVar46 = -(uint)(0.0 < (fVar91 * (fVar235 - fVar199) - fVar199 * (fVar262 - fVar91)) * 0.0 +
                               (fVar199 * (fVar177 - fVar149) - (fVar235 - fVar199) * fVar149) * 0.0
                               + ((fVar262 - fVar91) * fVar149 - (fVar177 - fVar149) * fVar91));
        uVar47 = -(uint)(0.0 < (fVar97 * (fVar242 - fVar208) - fVar208 * (fVar266 - fVar97)) * 0.0 +
                               (fVar208 * (fVar198 - fVar131) - (fVar242 - fVar208) * fVar131) * 0.0
                               + ((fVar266 - fVar97) * fVar131 - (fVar198 - fVar131) * fVar97));
        uVar48 = -(uint)(0.0 < (fVar112 * (fVar245 - fVar210) - fVar210 * (fVar270 - fVar112)) * 0.0
                               + (fVar210 * (fVar201 - fVar173) - (fVar245 - fVar210) * fVar173) *
                                 0.0 + ((fVar270 - fVar112) * fVar173 -
                                       (fVar201 - fVar173) * fVar112));
        uVar49 = -(uint)(0.0 < (fVar122 * (fVar98 - fVar214) - fVar214 * (fVar232 - fVar122)) * 0.0
                               + (fVar214 * (fVar204 - fVar176) - (fVar98 - fVar214) * fVar176) *
                                 0.0 + ((fVar232 - fVar122) * fVar176 -
                                       (fVar204 - fVar176) * fVar122));
        fVar230 = (float)((uint)(fVar246 - fVar230) & uVar46 | ~uVar46 & (uint)(fVar234 + fVar216));
        fVar233 = (float)((uint)(fVar197 - fVar111) & uVar47 | ~uVar47 & (uint)(fVar241 + fVar233));
        fVar240 = (float)((uint)(fVar200 - fVar113) & uVar48 | ~uVar48 & (uint)(fVar244 + fVar240));
        fVar243 = (float)((uint)(fVar203 - fVar114) & uVar49 | ~uVar49 & (uint)(fVar247 + fVar243));
        fVar247 = (float)((uint)(fVar217 - fVar205) & uVar46 | ~uVar46 & (uint)(fVar259 + fVar92));
        fVar259 = (float)((uint)(fVar218 - fVar209) & uVar47 | ~uVar47 & (uint)(fVar261 + fVar110));
        fVar261 = (float)((uint)(fVar226 - fVar213) & uVar48 | ~uVar48 & (uint)(fVar265 + fVar115));
        fVar265 = (float)((uint)(fVar228 - fVar215) & uVar49 | ~uVar49 & (uint)(fVar269 + fVar148));
        fVar216 = (float)((uint)(fVar53 - fVar124) & uVar46 | ~uVar46 & (uint)(fVar125 + fVar219));
        fVar217 = (float)((uint)(fVar89 - fVar133) & uVar47 | ~uVar47 & (uint)(fVar132 + fVar227));
        fVar218 = (float)((uint)(fVar93 - fVar174) & uVar48 | ~uVar48 & (uint)(fVar134 + fVar229));
        fVar226 = (float)((uint)(fVar95 - fVar196) & uVar49 | ~uVar49 & (uint)(fVar135 + fVar231));
        fVar124 = (float)((uint)fVar149 & uVar46 | ~uVar46 & (uint)fVar177);
        fVar133 = (float)((uint)fVar131 & uVar47 | ~uVar47 & (uint)fVar198);
        fVar174 = (float)((uint)fVar173 & uVar48 | ~uVar48 & (uint)fVar201);
        fVar196 = (float)((uint)fVar176 & uVar49 | ~uVar49 & (uint)fVar204);
        fVar92 = (float)((uint)fVar91 & uVar46 | ~uVar46 & (uint)fVar262);
        fVar110 = (float)((uint)fVar97 & uVar47 | ~uVar47 & (uint)fVar266);
        fVar115 = (float)((uint)fVar112 & uVar48 | ~uVar48 & (uint)fVar270);
        fVar148 = (float)((uint)fVar122 & uVar49 | ~uVar49 & (uint)fVar232);
        fVar205 = (float)((uint)fVar199 & uVar46 | ~uVar46 & (uint)fVar235);
        fVar209 = (float)((uint)fVar208 & uVar47 | ~uVar47 & (uint)fVar242);
        fVar213 = (float)((uint)fVar210 & uVar48 | ~uVar48 & (uint)fVar245);
        fVar215 = (float)((uint)fVar214 & uVar49 | ~uVar49 & (uint)fVar98);
        fVar228 = (float)((uint)fVar177 & uVar46 | ~uVar46 & (uint)fVar149) - fVar230;
        fVar246 = (float)((uint)fVar198 & uVar47 | ~uVar47 & (uint)fVar131) - fVar233;
        fVar177 = (float)((uint)fVar201 & uVar48 | ~uVar48 & (uint)fVar173) - fVar240;
        fVar197 = (float)((uint)fVar204 & uVar49 | ~uVar49 & (uint)fVar176) - fVar243;
        fVar198 = (float)((uint)fVar262 & uVar46 | ~uVar46 & (uint)fVar91) - fVar247;
        fVar200 = (float)((uint)fVar266 & uVar47 | ~uVar47 & (uint)fVar97) - fVar259;
        fVar201 = (float)((uint)fVar270 & uVar48 | ~uVar48 & (uint)fVar112) - fVar261;
        fVar203 = (float)((uint)fVar232 & uVar49 | ~uVar49 & (uint)fVar122) - fVar265;
        fVar199 = (float)((uint)fVar235 & uVar46 | ~uVar46 & (uint)fVar199) - fVar216;
        fVar208 = (float)((uint)fVar242 & uVar47 | ~uVar47 & (uint)fVar208) - fVar217;
        fVar210 = (float)((uint)fVar245 & uVar48 | ~uVar48 & (uint)fVar210) - fVar218;
        fVar214 = (float)((uint)fVar98 & uVar49 | ~uVar49 & (uint)fVar214) - fVar226;
        fVar262 = fVar230 - fVar124;
        fVar266 = fVar233 - fVar133;
        fVar269 = fVar240 - fVar174;
        fVar270 = fVar243 - fVar196;
        fVar149 = fVar247 - fVar92;
        fVar131 = fVar259 - fVar110;
        fVar173 = fVar261 - fVar115;
        fVar176 = fVar265 - fVar148;
        fVar91 = fVar216 - fVar205;
        fVar97 = fVar217 - fVar209;
        fVar112 = fVar218 - fVar213;
        fVar122 = fVar226 - fVar215;
        fVar204 = (fVar247 * fVar199 - fVar216 * fVar198) * 0.0 +
                  (fVar216 * fVar228 - fVar230 * fVar199) * 0.0 +
                  (fVar230 * fVar198 - fVar247 * fVar228);
        fVar234 = (fVar259 * fVar208 - fVar217 * fVar200) * 0.0 +
                  (fVar217 * fVar246 - fVar233 * fVar208) * 0.0 +
                  (fVar233 * fVar200 - fVar259 * fVar246);
        auVar127._4_4_ = fVar234;
        auVar127._0_4_ = fVar204;
        fVar241 = (fVar261 * fVar210 - fVar218 * fVar201) * 0.0 +
                  (fVar218 * fVar177 - fVar240 * fVar210) * 0.0 +
                  (fVar240 * fVar201 - fVar261 * fVar177);
        fVar244 = (fVar265 * fVar214 - fVar226 * fVar203) * 0.0 +
                  (fVar226 * fVar197 - fVar243 * fVar214) * 0.0 +
                  (fVar243 * fVar203 - fVar265 * fVar197);
        auVar253._0_4_ =
             (fVar92 * fVar91 - fVar205 * fVar149) * 0.0 +
             (fVar205 * fVar262 - fVar124 * fVar91) * 0.0 + (fVar124 * fVar149 - fVar92 * fVar262);
        auVar253._4_4_ =
             (fVar110 * fVar97 - fVar209 * fVar131) * 0.0 +
             (fVar209 * fVar266 - fVar133 * fVar97) * 0.0 + (fVar133 * fVar131 - fVar110 * fVar266);
        auVar253._8_4_ =
             (fVar115 * fVar112 - fVar213 * fVar173) * 0.0 +
             (fVar213 * fVar269 - fVar174 * fVar112) * 0.0 + (fVar174 * fVar173 - fVar115 * fVar269)
        ;
        auVar253._12_4_ =
             (fVar148 * fVar122 - fVar215 * fVar176) * 0.0 +
             (fVar215 * fVar270 - fVar196 * fVar122) * 0.0 + (fVar196 * fVar176 - fVar148 * fVar270)
        ;
        auVar127._8_4_ = fVar241;
        auVar127._12_4_ = fVar244;
        auVar64 = maxps(auVar127,auVar253);
        bVar45 = auVar64._0_4_ <= 0.0 && bVar45;
        auVar128._0_4_ = -(uint)bVar45;
        bVar30 = auVar64._4_4_ <= 0.0 && bVar30;
        auVar128._4_4_ = -(uint)bVar30;
        bVar31 = auVar64._8_4_ <= 0.0 && bVar31;
        auVar128._8_4_ = -(uint)bVar31;
        bVar32 = auVar64._12_4_ <= 0.0 && bVar32;
        auVar128._12_4_ = -(uint)bVar32;
        iVar34 = movmskps(iVar34,auVar128);
        if (iVar34 == 0) {
LAB_00b6b2fd:
          iVar34 = 0;
          auVar79._8_8_ = uStack_390;
          auVar79._0_8_ = local_398;
        }
        else {
          fVar124 = fVar149 * fVar199 - fVar91 * fVar198;
          fVar133 = fVar131 * fVar208 - fVar97 * fVar200;
          fVar174 = fVar173 * fVar210 - fVar112 * fVar201;
          fVar196 = fVar176 * fVar214 - fVar122 * fVar203;
          fVar91 = fVar91 * fVar228 - fVar199 * fVar262;
          fVar97 = fVar97 * fVar246 - fVar208 * fVar266;
          fVar112 = fVar112 * fVar177 - fVar210 * fVar269;
          fVar122 = fVar122 * fVar197 - fVar214 * fVar270;
          fVar149 = fVar262 * fVar198 - fVar149 * fVar228;
          fVar131 = fVar266 * fVar200 - fVar131 * fVar246;
          fVar173 = fVar269 * fVar201 - fVar173 * fVar177;
          fVar176 = fVar270 * fVar203 - fVar176 * fVar197;
          auVar141._0_12_ = ZEXT812(0);
          auVar141._12_4_ = 0;
          auVar160._0_4_ = fVar124 * 0.0 + fVar91 * 0.0 + fVar149;
          auVar160._4_4_ = fVar133 * 0.0 + fVar97 * 0.0 + fVar131;
          auVar160._8_4_ = fVar174 * 0.0 + fVar112 * 0.0 + fVar173;
          auVar160._12_4_ = fVar196 * 0.0 + fVar122 * 0.0 + fVar176;
          auVar64 = rcpps(auVar141,auVar160);
          fVar92 = auVar64._0_4_;
          fVar110 = auVar64._4_4_;
          fVar115 = auVar64._8_4_;
          fVar148 = auVar64._12_4_;
          fVar92 = (1.0 - auVar160._0_4_ * fVar92) * fVar92 + fVar92;
          fVar110 = (1.0 - auVar160._4_4_ * fVar110) * fVar110 + fVar110;
          fVar115 = (1.0 - auVar160._8_4_ * fVar115) * fVar115 + fVar115;
          fVar148 = (1.0 - auVar160._12_4_ * fVar148) * fVar148 + fVar148;
          fVar149 = (fVar216 * fVar149 + fVar247 * fVar91 + fVar230 * fVar124) * fVar92;
          fVar97 = (fVar217 * fVar131 + fVar259 * fVar97 + fVar233 * fVar133) * fVar110;
          auVar224._4_4_ = fVar97;
          auVar224._0_4_ = fVar149;
          fVar112 = (fVar218 * fVar173 + fVar261 * fVar112 + fVar240 * fVar174) * fVar115;
          fVar122 = (fVar226 * fVar176 + fVar265 * fVar122 + fVar243 * fVar196) * fVar148;
          fVar91 = *(float *)(ray + k * 4 + 0x80);
          bVar45 = (fVar123 <= fVar149 && fVar149 <= fVar91) && bVar45;
          auVar142._0_4_ = -(uint)bVar45;
          bVar30 = (fVar123 <= fVar97 && fVar97 <= fVar91) && bVar30;
          auVar142._4_4_ = -(uint)bVar30;
          bVar31 = (fVar123 <= fVar112 && fVar112 <= fVar91) && bVar31;
          auVar142._8_4_ = -(uint)bVar31;
          bVar32 = (fVar123 <= fVar122 && fVar122 <= fVar91) && bVar32;
          auVar142._12_4_ = -(uint)bVar32;
          iVar34 = movmskps(iVar34,auVar142);
          if (iVar34 == 0) goto LAB_00b6b2fd;
          auVar143._0_8_ =
               CONCAT44(-(uint)(auVar160._4_4_ != 0.0 && bVar30),
                        -(uint)(auVar160._0_4_ != 0.0 && bVar45));
          auVar143._8_4_ = -(uint)(auVar160._8_4_ != 0.0 && bVar31);
          auVar143._12_4_ = -(uint)(auVar160._12_4_ != 0.0 && bVar32);
          iVar34 = movmskps(iVar34,auVar143);
          auVar79._8_8_ = uStack_390;
          auVar79._0_8_ = local_398;
          if (iVar34 != 0) {
            fVar204 = fVar204 * fVar92;
            fVar234 = fVar234 * fVar110;
            fVar241 = fVar241 * fVar115;
            fVar244 = fVar244 * fVar148;
            local_78 = (float)((uint)(1.0 - fVar204) & uVar46 | ~uVar46 & (uint)fVar204);
            fStack_74 = (float)((uint)(1.0 - fVar234) & uVar47 | ~uVar47 & (uint)fVar234);
            fStack_70 = (float)((uint)(1.0 - fVar241) & uVar48 | ~uVar48 & (uint)fVar241);
            fStack_6c = (float)((uint)(1.0 - fVar244) & uVar49 | ~uVar49 & (uint)fVar244);
            local_288 = (float)(~uVar46 & (uint)(auVar253._0_4_ * fVar92) |
                               (uint)(1.0 - auVar253._0_4_ * fVar92) & uVar46);
            fStack_284 = (float)(~uVar47 & (uint)(auVar253._4_4_ * fVar110) |
                                (uint)(1.0 - auVar253._4_4_ * fVar110) & uVar47);
            fStack_280 = (float)(~uVar48 & (uint)(auVar253._8_4_ * fVar115) |
                                (uint)(1.0 - auVar253._8_4_ * fVar115) & uVar48);
            fStack_27c = (float)(~uVar49 & (uint)(auVar253._12_4_ * fVar148) |
                                (uint)(1.0 - auVar253._12_4_ * fVar148) & uVar49);
            auVar79._8_4_ = auVar143._8_4_;
            auVar79._0_8_ = auVar143._0_8_;
            auVar79._12_4_ = auVar143._12_4_;
            auVar224._8_4_ = fVar112;
            auVar224._12_4_ = fVar122;
            auVar223 = auVar224;
          }
        }
        uVar202 = *(undefined8 *)(pfVar3 + 2);
        uVar178 = *(undefined8 *)pfVar3;
        uVar166 = *(undefined8 *)(pfVar2 + 2);
        uVar151 = *(undefined8 *)pfVar2;
        uVar175 = *(undefined8 *)(pfVar1 + 2);
        uVar168 = *(undefined8 *)pfVar1;
        iVar34 = movmskps(iVar34,auVar79);
        if (iVar34 == 0) {
          uVar46 = 0;
        }
        else {
          fVar91 = (auVar211._0_4_ - auVar118._0_4_) * local_78 + auVar118._0_4_;
          fVar92 = (auVar211._4_4_ - auVar118._4_4_) * fStack_74 + auVar118._4_4_;
          fVar97 = (auVar211._8_4_ - auVar118._8_4_) * fStack_70 + auVar118._8_4_;
          fVar110 = (auVar211._12_4_ - auVar118._12_4_) * fStack_6c + auVar118._12_4_;
          fVar123 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          local_1c8._0_4_ = -(uint)(fVar123 * (fVar91 + fVar91) < auVar223._0_4_) & auVar79._0_4_;
          local_1c8._4_4_ = -(uint)(fVar123 * (fVar92 + fVar92) < auVar223._4_4_) & auVar79._4_4_;
          local_1c8._8_4_ = -(uint)(fVar123 * (fVar97 + fVar97) < auVar223._8_4_) & auVar79._8_4_;
          local_1c8._12_4_ =
               -(uint)(fVar123 * (fVar110 + fVar110) < auVar223._12_4_) & auVar79._12_4_;
          uVar46 = movmskps(iVar34,local_1c8);
          if (uVar46 != 0) {
            local_288 = local_288 + local_288 + -1.0;
            fStack_284 = fStack_284 + fStack_284 + -1.0;
            fStack_280 = fStack_280 + fStack_280 + -1.0;
            fStack_27c = fStack_27c + fStack_27c + -1.0;
            local_248 = local_78;
            fStack_244 = fStack_74;
            fStack_240 = fStack_70;
            fStack_23c = fStack_6c;
            local_218 = 0;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar45 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar52 = 1.0 / fVar52;
                local_1b8[0] = fVar52 * (local_78 + 0.0);
                local_1b8[1] = fVar52 * (fStack_74 + 1.0);
                local_1b8[2] = fVar52 * (fStack_70 + 2.0);
                local_1b8[3] = fVar52 * (fStack_6c + 3.0);
                local_1a8 = CONCAT44(fStack_284,local_288);
                uStack_1a0 = CONCAT44(fStack_27c,fStack_280);
                local_198 = auVar223;
                pGVar40 = (Geometry *)(ulong)(byte)uVar46;
                uVar43 = 0;
                if (pGVar40 != (Geometry *)0x0) {
                  for (; ((byte)uVar46 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                local_428._0_4_ = local_428._4_4_;
                uStack_420._0_4_ = local_428._4_4_;
                uStack_420._4_4_ = local_428._4_4_;
                local_3e8 = CONCAT44((uint)uStack_3e0,(uint)uStack_3e0);
                uStack_3e0._4_4_ = (uint)uStack_3e0;
                uVar12 = *local_310;
                uVar13 = local_310[1];
                bVar45 = true;
                local_238 = local_288;
                fStack_234 = fStack_284;
                fStack_230 = fStack_280;
                fStack_22c = fStack_27c;
                _local_228 = auVar223;
                local_214 = iVar7;
                local_1f8 = uVar168;
                uStack_1f0 = uVar175;
                local_1e8 = uVar151;
                uStack_1e0 = uVar166;
                local_1d8 = uVar178;
                uStack_1d0 = uVar202;
                do {
                  local_118 = local_1b8[uVar43];
                  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_108 = *(undefined4 *)((long)&local_1a8 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + uVar43 * 4);
                  fVar123 = 1.0 - local_118;
                  fVar91 = local_118 * 3.0;
                  fVar92 = ((fVar91 + 2.0) * (fVar123 + fVar123) + fVar123 * -3.0 * fVar123) * 0.5;
                  fVar52 = (local_118 * local_118 + fVar123 * -2.0 * local_118) * 0.5;
                  local_4a8 = (float)uVar178;
                  fStack_4a4 = (float)((ulong)uVar178 >> 0x20);
                  fStack_4a0 = (float)uVar202;
                  local_438 = (float)uVar151;
                  fStack_434 = (float)((ulong)uVar151 >> 0x20);
                  fStack_430 = (float)uVar166;
                  fVar91 = (local_118 * fVar91 + (fVar91 + -5.0) * (local_118 + local_118)) * 0.5;
                  local_3d8 = (float)uVar168;
                  fStack_3d4 = (float)((ulong)uVar168 >> 0x20);
                  fStack_3d0 = (float)uVar175;
                  local_308.context = context->user;
                  fVar123 = (local_118 * (fVar123 + fVar123) - fVar123 * fVar123) * 0.5;
                  local_148 = fVar123 * local_338 +
                              fVar91 * local_3d8 + fVar92 * local_438 + fVar52 * local_4a8;
                  local_138 = fVar123 * fStack_334 +
                              fVar91 * fStack_3d4 + fVar92 * fStack_434 + fVar52 * fStack_4a4;
                  local_128 = fVar123 * fStack_330 +
                              fVar91 * fStack_3d0 + fVar92 * fStack_430 + fVar52 * fStack_4a0;
                  fStack_144 = local_148;
                  fStack_140 = local_148;
                  fStack_13c = local_148;
                  fStack_134 = local_138;
                  fStack_130 = local_138;
                  fStack_12c = local_138;
                  fStack_124 = local_128;
                  fStack_120 = local_128;
                  fStack_11c = local_128;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  uStack_104 = local_108;
                  uStack_100 = local_108;
                  uStack_fc = local_108;
                  local_f8 = local_3e8;
                  uStack_f0 = uStack_3e0;
                  local_e8 = local_428;
                  uStack_e0 = uStack_420;
                  local_d8 = (local_308.context)->instID[0];
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = (local_308.context)->instPrimID[0];
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_308.valid = (int *)&local_3b8;
                  local_308.geometryUserPtr = pGVar8->userPtr;
                  local_308.hit = (RTCHitN *)&local_148;
                  local_308.N = 4;
                  p_Var35 = pGVar8->occlusionFilterN;
                  local_3b8 = uVar12;
                  uStack_3b0 = uVar13;
                  local_308.ray = (RTCRayN *)ray;
                  if (p_Var35 != (RTCFilterFunctionN)0x0) {
                    p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_308);
                  }
                  auVar80._0_4_ = -(uint)((int)local_3b8 == 0);
                  auVar80._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                  auVar80._8_4_ = -(uint)((int)uStack_3b0 == 0);
                  auVar80._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                  uVar46 = movmskps((int)p_Var35,auVar80);
                  pRVar36 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                  if ((uVar46 ^ 0xf) == 0) {
                    auVar80 = auVar80 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var35 = context->args->filter;
                    if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var35)(&local_308);
                    }
                    auVar107._0_4_ = -(uint)((int)local_3b8 == 0);
                    auVar107._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                    auVar107._8_4_ = -(uint)((int)uStack_3b0 == 0);
                    auVar107._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                    auVar80 = auVar107 ^ _DAT_01febe20;
                    *(undefined1 (*) [16])(local_308.ray + 0x80) =
                         ~auVar107 & _DAT_01feba00 |
                         *(undefined1 (*) [16])(local_308.ray + 0x80) & auVar107;
                    pRVar36 = local_308.ray;
                  }
                  auVar81._0_4_ = auVar80._0_4_ << 0x1f;
                  auVar81._4_4_ = auVar80._4_4_ << 0x1f;
                  auVar81._8_4_ = auVar80._8_4_ << 0x1f;
                  auVar81._12_4_ = auVar80._12_4_ << 0x1f;
                  iVar34 = movmskps((int)pRVar36,auVar81);
                  uVar46 = (uint)uVar43;
                  if (iVar34 != 0) break;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
                  pGVar40 = (Geometry *)((ulong)pGVar40 ^ 1L << (uVar43 & 0x3f));
                  uVar43 = 0;
                  if (pGVar40 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  bVar45 = pGVar40 != (Geometry *)0x0;
                } while (bVar45);
              }
              goto LAB_00b6a281;
            }
          }
        }
        bVar45 = false;
      }
LAB_00b6a281:
      if (4 < iVar7) {
        local_88 = iVar7;
        iStack_84 = iVar7;
        iStack_80 = iVar7;
        iStack_7c = iVar7;
        local_2b8._4_4_ = local_2b8._0_4_;
        fStack_2b0 = (float)local_2b8._0_4_;
        fStack_2ac = (float)local_2b8._0_4_;
        local_b8 = 1.0 / (float)local_2d8._0_4_;
        fStack_b4 = local_b8;
        fStack_b0 = local_b8;
        fStack_ac = local_b8;
        local_98 = (undefined4)local_3a0;
        uStack_94 = (undefined4)local_3a0;
        uStack_90 = (undefined4)local_3a0;
        uStack_8c = (undefined4)local_3a0;
        local_a8 = local_2c8._0_4_;
        uStack_a4 = local_2c8._0_4_;
        uStack_a0 = local_2c8._0_4_;
        uStack_9c = local_2c8._0_4_;
        lVar41 = 4;
        fStack_354 = local_358;
        fStack_350 = local_358;
        fStack_34c = local_358;
        fVar123 = local_368;
        fVar52 = fStack_364;
        fVar91 = fStack_360;
        fVar92 = fStack_35c;
        do {
          fVar201 = fStack_340;
          fVar200 = fStack_344;
          fVar198 = local_348;
          fVar197 = fStack_370;
          fVar177 = fStack_374;
          fVar246 = local_378;
          fVar243 = fStack_380;
          fVar240 = fStack_384;
          fVar233 = local_388;
          local_218 = (uint)lVar41;
          pfVar1 = (float *)(catmullrom_basis0 + lVar41 * 4 + lVar10);
          fVar97 = *pfVar1;
          fVar110 = pfVar1[1];
          fVar112 = pfVar1[2];
          fVar115 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x22307f0 + lVar41 * 4);
          fVar122 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar149 = pfVar1[2];
          fVar124 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x2230c74 + lVar41 * 4);
          local_278 = *pfVar1;
          fStack_274 = pfVar1[1];
          fStack_270 = pfVar1[2];
          fStack_26c = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x22310f8 + lVar41 * 4);
          fVar131 = *pfVar1;
          fVar133 = pfVar1[1];
          fVar173 = pfVar1[2];
          fVar174 = pfVar1[3];
          fVar203 = local_2a8 * fVar97 + fVar167 * fVar122 + fVar165 * local_278 + fVar87 * fVar131;
          fVar204 = fStack_2a4 * fVar110 +
                    fVar167 * fVar148 + fVar165 * fStack_274 + fVar87 * fVar133;
          fVar234 = fStack_2a0 * fVar112 +
                    fVar167 * fVar149 + fVar165 * fStack_270 + fVar87 * fVar173;
          fVar241 = fStack_29c * fVar115 +
                    fVar167 * fVar124 + fVar165 * fStack_26c + fVar87 * fVar174;
          fVar245 = local_268 * fVar97 + fVar150 * fVar122 + fVar123 * local_278 + fVar88 * fVar131;
          fVar89 = fStack_264 * fVar110 + fVar150 * fVar148 + fVar52 * fStack_274 + fVar88 * fVar133
          ;
          fVar95 = fStack_260 * fVar112 + fVar150 * fVar149 + fVar91 * fStack_270 + fVar88 * fVar173
          ;
          fVar111 = fStack_25c * fVar115 +
                    fVar150 * fVar124 + fVar92 * fStack_26c + fVar88 * fVar174;
          auVar238._0_4_ =
               local_168 * fVar97 + local_158 * fVar122 + local_58 * local_278 + local_68 * fVar131;
          auVar238._4_4_ =
               fStack_164 * fVar110 +
               fStack_154 * fVar148 + fStack_54 * fStack_274 + fStack_64 * fVar133;
          auVar238._8_4_ =
               fStack_160 * fVar112 +
               fStack_150 * fVar149 + fStack_50 * fStack_270 + fStack_60 * fVar173;
          auVar238._12_4_ =
               fStack_15c * fVar115 +
               fStack_14c * fVar124 + fStack_4c * fStack_26c + fStack_5c * fVar174;
          puVar37 = catmullrom_basis1 + lVar10;
          pfVar1 = (float *)(puVar37 + lVar41 * 4);
          fVar176 = *pfVar1;
          fVar196 = pfVar1[1];
          fVar199 = pfVar1[2];
          fVar205 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x2232c10 + lVar41 * 4);
          fVar208 = *pfVar1;
          fVar209 = pfVar1[1];
          fVar210 = pfVar1[2];
          fVar213 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x2233094 + lVar41 * 4);
          fVar214 = *pfVar1;
          fVar215 = pfVar1[1];
          fVar216 = pfVar1[2];
          fVar217 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x2233518 + lVar41 * 4);
          fVar218 = *pfVar1;
          fVar226 = pfVar1[1];
          fVar228 = pfVar1[2];
          fVar230 = pfVar1[3];
          fVar262 = local_2a8 * fVar176 + fVar167 * fVar208 + fVar165 * fVar214 + fVar87 * fVar218;
          fVar265 = fStack_2a4 * fVar196 + fVar167 * fVar209 + fVar165 * fVar215 + fVar87 * fVar226;
          fVar266 = fStack_2a0 * fVar199 + fVar167 * fVar210 + fVar165 * fVar216 + fVar87 * fVar228;
          fVar269 = fStack_29c * fVar205 + fVar167 * fVar213 + fVar165 * fVar217 + fVar87 * fVar230;
          fVar270 = local_268 * fVar176 + fVar150 * fVar208 + fVar123 * fVar214 + fVar88 * fVar218;
          fVar232 = fStack_264 * fVar196 + fVar150 * fVar209 + fVar52 * fVar215 + fVar88 * fVar226;
          fVar235 = fStack_260 * fVar199 + fVar150 * fVar210 + fVar91 * fVar216 + fVar88 * fVar228;
          fVar242 = fStack_25c * fVar205 + fVar150 * fVar213 + fVar92 * fVar217 + fVar88 * fVar230;
          auVar254._0_4_ =
               local_168 * fVar176 + local_158 * fVar208 + local_58 * fVar214 + local_68 * fVar218;
          auVar254._4_4_ =
               fStack_164 * fVar196 +
               fStack_154 * fVar209 + fStack_54 * fVar215 + fStack_64 * fVar226;
          auVar254._8_4_ =
               fStack_160 * fVar199 +
               fStack_150 * fVar210 + fStack_50 * fVar216 + fStack_60 * fVar228;
          auVar254._12_4_ =
               fStack_15c * fVar205 +
               fStack_14c * fVar213 + fStack_4c * fVar217 + fStack_5c * fVar230;
          fVar244 = fVar262 - fVar203;
          fVar247 = fVar265 - fVar204;
          fVar259 = fVar266 - fVar234;
          fVar261 = fVar269 - fVar241;
          local_2d8._0_4_ = fVar270 - fVar245;
          local_2d8._4_4_ = fVar232 - fVar89;
          fStack_2d0 = fVar235 - fVar95;
          fStack_2cc = fVar242 - fVar111;
          fVar53 = fVar245 * fVar244 - fVar203 * (float)local_2d8._0_4_;
          fVar93 = fVar89 * fVar247 - fVar204 * (float)local_2d8._4_4_;
          fVar98 = fVar95 * fVar259 - fVar234 * fStack_2d0;
          fVar113 = fVar111 * fVar261 - fVar241 * fStack_2cc;
          auVar64 = maxps(auVar238,auVar254);
          bVar32 = fVar53 * fVar53 <=
                   auVar64._0_4_ * auVar64._0_4_ *
                   (fVar244 * fVar244 + (float)local_2d8._0_4_ * (float)local_2d8._0_4_) &&
                   (int)local_218 < local_88;
          auVar195._0_4_ = -(uint)bVar32;
          bVar33 = fVar93 * fVar93 <=
                   auVar64._4_4_ * auVar64._4_4_ *
                   (fVar247 * fVar247 + (float)local_2d8._4_4_ * (float)local_2d8._4_4_) &&
                   (int)(local_218 | 1) < iStack_84;
          auVar195._4_4_ = -(uint)bVar33;
          bVar31 = fVar98 * fVar98 <=
                   auVar64._8_4_ * auVar64._8_4_ * (fVar259 * fVar259 + fStack_2d0 * fStack_2d0) &&
                   (int)(local_218 | 2) < iStack_80;
          auVar195._8_4_ = -(uint)bVar31;
          bVar30 = fVar113 * fVar113 <=
                   auVar64._12_4_ * auVar64._12_4_ * (fVar261 * fVar261 + fStack_2cc * fStack_2cc)
                   && (int)(local_218 | 3) < iStack_7c;
          auVar195._12_4_ = -(uint)bVar30;
          uVar46 = movmskps((int)pGVar40,auVar195);
          pGVar40 = (Geometry *)(ulong)uVar46;
          if (uVar46 == 0) {
LAB_00b6b24d:
            uVar46 = (uint)puVar37;
          }
          else {
            fVar114 = fVar218 * fVar51 + fVar214 * fVar136 + fVar208 * local_328 + fVar176 * fVar164
            ;
            fVar125 = fVar226 * fVar51 + fVar215 * fVar136 + fVar209 * fStack_324 +
                      fVar196 * fVar164;
            fVar132 = fVar228 * fVar51 + fVar216 * fVar136 + fVar210 * fStack_320 +
                      fVar199 * fVar164;
            fVar134 = fVar230 * fVar51 + fVar217 * fVar136 + fVar213 * fStack_31c +
                      fVar205 * fVar164;
            fVar53 = fVar131 * fVar51 + local_278 * fVar136 + fVar122 * local_328 + fVar97 * fVar164
            ;
            fVar93 = fVar133 * fVar51 + fStack_274 * fVar136 + fVar148 * fStack_324 +
                     fVar110 * fVar164;
            fVar98 = fVar173 * fVar51 + fStack_270 * fVar136 + fVar149 * fStack_320 +
                     fVar112 * fVar164;
            fVar113 = fVar174 * fVar51 + fStack_26c * fVar136 + fVar124 * fStack_31c +
                      fVar115 * fVar164;
            pfVar1 = (float *)(lVar10 + 0x223157c + lVar41 * 4);
            fVar97 = *pfVar1;
            fVar110 = pfVar1[1];
            fVar112 = pfVar1[2];
            fVar115 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x2231a00 + lVar41 * 4);
            fVar122 = *pfVar1;
            fVar148 = pfVar1[1];
            fVar149 = pfVar1[2];
            fVar124 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x2231e84 + lVar41 * 4);
            fVar131 = *pfVar1;
            fVar133 = pfVar1[1];
            fVar173 = pfVar1[2];
            fVar174 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x2232308 + lVar41 * 4);
            fVar176 = *pfVar1;
            fVar196 = pfVar1[1];
            fVar199 = pfVar1[2];
            fVar205 = pfVar1[3];
            fVar231 = local_2a8 * fVar97 + fVar167 * fVar122 + fVar165 * fVar131 + fVar87 * fVar176;
            fVar252 = fStack_2a4 * fVar110 +
                      fVar167 * fVar148 + fVar165 * fVar133 + fVar87 * fVar196;
            fVar256 = fStack_2a0 * fVar112 +
                      fVar167 * fVar149 + fVar165 * fVar173 + fVar87 * fVar199;
            fVar257 = fStack_29c * fVar115 +
                      fVar167 * fVar124 + fVar165 * fVar174 + fVar87 * fVar205;
            fVar135 = local_268 * fVar97 + fVar150 * fVar122 + fVar123 * fVar131 + fVar88 * fVar176;
            fVar219 = fStack_264 * fVar110 + fVar150 * fVar148 + fVar52 * fVar133 + fVar88 * fVar196
            ;
            fVar227 = fStack_260 * fVar112 + fVar150 * fVar149 + fVar91 * fVar173 + fVar88 * fVar199
            ;
            fVar229 = fStack_25c * fVar115 + fVar150 * fVar124 + fVar92 * fVar174 + fVar88 * fVar205
            ;
            pfVar1 = (float *)(lVar10 + 0x223399c + lVar41 * 4);
            fVar123 = *pfVar1;
            fVar52 = pfVar1[1];
            fVar91 = pfVar1[2];
            fVar92 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x22342a4 + lVar41 * 4);
            fVar208 = *pfVar1;
            fVar209 = pfVar1[1];
            fVar210 = pfVar1[2];
            fVar213 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x2234728 + lVar41 * 4);
            fVar214 = *pfVar1;
            fVar215 = pfVar1[1];
            fVar216 = pfVar1[2];
            fVar217 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x2233e20 + lVar41 * 4);
            fVar218 = *pfVar1;
            fVar226 = pfVar1[1];
            fVar228 = pfVar1[2];
            fVar230 = pfVar1[3];
            fVar258 = local_2a8 * fVar123 + fVar167 * fVar218 + fVar165 * fVar208 + fVar87 * fVar214
            ;
            fVar260 = fStack_2a4 * fVar52 + fVar167 * fVar226 + fVar165 * fVar209 + fVar87 * fVar215
            ;
            fVar263 = fStack_2a0 * fVar91 + fVar167 * fVar228 + fVar165 * fVar210 + fVar87 * fVar216
            ;
            fVar267 = fStack_29c * fVar92 + fVar167 * fVar230 + fVar165 * fVar213 + fVar87 * fVar217
            ;
            fVar271 = local_268 * fVar123 +
                      fVar150 * fVar218 + local_368 * fVar208 + fVar88 * fVar214;
            fVar264 = fStack_264 * fVar52 +
                      fVar150 * fVar226 + fStack_364 * fVar209 + fVar88 * fVar215;
            fVar268 = fStack_260 * fVar91 +
                      fVar150 * fVar228 + fStack_360 * fVar210 + fVar88 * fVar216;
            fVar272 = fStack_25c * fVar92 +
                      fVar150 * fVar230 + fStack_35c * fVar213 + fVar88 * fVar217;
            auVar239._0_8_ = CONCAT44(fVar252,fVar231) & 0x7fffffff7fffffff;
            auVar239._8_4_ = ABS(fVar256);
            auVar239._12_4_ = ABS(fVar257);
            auVar161._0_8_ = CONCAT44(fVar219,fVar135) & 0x7fffffff7fffffff;
            auVar161._8_4_ = ABS(fVar227);
            auVar161._12_4_ = ABS(fVar229);
            auVar64 = maxps(auVar239,auVar161);
            auVar250._0_8_ =
                 CONCAT44(fVar110 * fVar164 +
                          fVar148 * fStack_324 + fVar133 * fVar136 + fVar196 * fVar51,
                          fVar97 * fVar164 +
                          fVar122 * local_328 + fVar131 * fVar136 + fVar176 * fVar51) &
                 0x7fffffff7fffffff;
            auVar250._8_4_ =
                 ABS(fVar112 * fVar164 + fVar149 * fStack_320 + fVar173 * fVar136 + fVar199 * fVar51
                    );
            auVar250._12_4_ =
                 ABS(fVar115 * fVar164 + fVar124 * fStack_31c + fVar174 * fVar136 + fVar205 * fVar51
                    );
            auVar64 = maxps(auVar64,auVar250);
            uVar46 = -(uint)(local_358 <= auVar64._0_4_);
            uVar47 = -(uint)(fStack_354 <= auVar64._4_4_);
            uVar48 = -(uint)(fStack_350 <= auVar64._8_4_);
            uVar49 = -(uint)(fStack_34c <= auVar64._12_4_);
            auVar162._0_4_ = ~uVar46 & (uint)fVar244;
            auVar162._4_4_ = ~uVar47 & (uint)fVar247;
            auVar162._8_4_ = ~uVar48 & (uint)fVar259;
            auVar162._12_4_ = ~uVar49 & (uint)fVar261;
            auVar225._0_4_ = (uint)fVar231 & uVar46;
            auVar225._4_4_ = (uint)fVar252 & uVar47;
            auVar225._8_4_ = (uint)fVar256 & uVar48;
            auVar225._12_4_ = (uint)fVar257 & uVar49;
            auVar225 = auVar225 | auVar162;
            fVar148 = (float)(~uVar46 & local_2d8._0_4_ | (uint)fVar135 & uVar46);
            fVar124 = (float)(~uVar47 & local_2d8._4_4_ | (uint)fVar219 & uVar47);
            fVar199 = (float)(~uVar48 & (uint)fStack_2d0 | (uint)fVar227 & uVar48);
            fVar205 = (float)(~uVar49 & (uint)fStack_2cc | (uint)fVar229 & uVar49);
            auVar251._0_8_ = CONCAT44(fVar260,fVar258) & 0x7fffffff7fffffff;
            auVar251._8_4_ = ABS(fVar263);
            auVar251._12_4_ = ABS(fVar267);
            auVar119._0_8_ = CONCAT44(fVar264,fVar271) & 0x7fffffff7fffffff;
            auVar119._8_4_ = ABS(fVar268);
            auVar119._12_4_ = ABS(fVar272);
            auVar64 = maxps(auVar251,auVar119);
            auVar82._0_8_ =
                 CONCAT44(fVar52 * fVar164 +
                          fVar226 * fStack_324 + fVar209 * fVar136 + fVar215 * fVar51,
                          fVar123 * fVar164 +
                          fVar218 * local_328 + fVar208 * fVar136 + fVar214 * fVar51) &
                 0x7fffffff7fffffff;
            auVar82._8_4_ =
                 ABS(fVar91 * fVar164 + fVar228 * fStack_320 + fVar210 * fVar136 + fVar216 * fVar51)
            ;
            auVar82._12_4_ =
                 ABS(fVar92 * fVar164 + fVar230 * fStack_31c + fVar213 * fVar136 + fVar217 * fVar51)
            ;
            auVar64 = maxps(auVar64,auVar82);
            uVar46 = -(uint)(local_358 <= auVar64._0_4_);
            uVar47 = -(uint)(fStack_354 <= auVar64._4_4_);
            uVar48 = -(uint)(fStack_350 <= auVar64._8_4_);
            uVar49 = -(uint)(fStack_34c <= auVar64._12_4_);
            fVar214 = (float)((uint)fVar258 & uVar46 | ~uVar46 & (uint)fVar244);
            fVar215 = (float)((uint)fVar260 & uVar47 | ~uVar47 & (uint)fVar247);
            fVar216 = (float)((uint)fVar263 & uVar48 | ~uVar48 & (uint)fVar259);
            fVar217 = (float)((uint)fVar267 & uVar49 | ~uVar49 & (uint)fVar261);
            fVar208 = (float)(~uVar46 & local_2d8._0_4_ | (uint)fVar271 & uVar46);
            fVar209 = (float)(~uVar47 & local_2d8._4_4_ | (uint)fVar264 & uVar47);
            fVar210 = (float)(~uVar48 & (uint)fStack_2d0 | (uint)fVar268 & uVar48);
            fVar213 = (float)(~uVar49 & (uint)fStack_2cc | (uint)fVar272 & uVar49);
            fVar115 = auVar225._0_4_;
            fVar123 = auVar225._4_4_;
            fVar52 = auVar225._8_4_;
            fVar91 = auVar225._12_4_;
            auVar144._0_4_ = fVar148 * fVar148 + fVar115 * fVar115;
            auVar144._4_4_ = fVar124 * fVar124 + fVar123 * fVar123;
            auVar144._8_4_ = fVar199 * fVar199 + fVar52 * fVar52;
            auVar144._12_4_ = fVar205 * fVar205 + fVar91 * fVar91;
            auVar64 = rsqrtps(auVar162,auVar144);
            fVar92 = auVar64._0_4_;
            fVar97 = auVar64._4_4_;
            fVar110 = auVar64._8_4_;
            fVar112 = auVar64._12_4_;
            auVar163._0_4_ = fVar92 * fVar92 * auVar144._0_4_ * 0.5 * fVar92;
            auVar163._4_4_ = fVar97 * fVar97 * auVar144._4_4_ * 0.5 * fVar97;
            auVar163._8_4_ = fVar110 * fVar110 * auVar144._8_4_ * 0.5 * fVar110;
            auVar163._12_4_ = fVar112 * fVar112 * auVar144._12_4_ * 0.5 * fVar112;
            fVar131 = fVar92 * 1.5 - auVar163._0_4_;
            fVar133 = fVar97 * 1.5 - auVar163._4_4_;
            fVar173 = fVar110 * 1.5 - auVar163._8_4_;
            fVar174 = fVar112 * 1.5 - auVar163._12_4_;
            auVar145._0_4_ = fVar208 * fVar208 + fVar214 * fVar214;
            auVar145._4_4_ = fVar209 * fVar209 + fVar215 * fVar215;
            auVar145._8_4_ = fVar210 * fVar210 + fVar216 * fVar216;
            auVar145._12_4_ = fVar213 * fVar213 + fVar217 * fVar217;
            auVar64 = rsqrtps(auVar163,auVar145);
            fVar92 = auVar64._0_4_;
            fVar97 = auVar64._4_4_;
            fVar110 = auVar64._8_4_;
            fVar112 = auVar64._12_4_;
            fVar122 = fVar92 * 1.5 - fVar92 * fVar92 * auVar145._0_4_ * 0.5 * fVar92;
            fVar97 = fVar97 * 1.5 - fVar97 * fVar97 * auVar145._4_4_ * 0.5 * fVar97;
            fVar149 = fVar110 * 1.5 - fVar110 * fVar110 * auVar145._8_4_ * 0.5 * fVar110;
            fVar112 = fVar112 * 1.5 - fVar112 * fVar112 * auVar145._12_4_ * 0.5 * fVar112;
            fVar176 = fVar148 * fVar131 * auVar238._0_4_;
            fVar196 = fVar124 * fVar133 * auVar238._4_4_;
            fVar199 = fVar199 * fVar173 * auVar238._8_4_;
            fVar205 = fVar205 * fVar174 * auVar238._12_4_;
            fVar110 = -fVar115 * fVar131 * auVar238._0_4_;
            fVar115 = -fVar123 * fVar133 * auVar238._4_4_;
            fVar148 = -fVar52 * fVar173 * auVar238._8_4_;
            fVar124 = -fVar91 * fVar174 * auVar238._12_4_;
            fVar218 = fVar131 * 0.0 * auVar238._0_4_;
            fVar226 = fVar133 * 0.0 * auVar238._4_4_;
            fVar228 = fVar173 * 0.0 * auVar238._8_4_;
            fVar230 = fVar174 * 0.0 * auVar238._12_4_;
            fVar258 = fVar208 * fVar122 * auVar254._0_4_;
            fVar260 = fVar209 * fVar97 * auVar254._4_4_;
            fVar263 = fVar210 * fVar149 * auVar254._8_4_;
            fVar267 = fVar213 * fVar112 * auVar254._12_4_;
            fVar244 = fVar262 + fVar258;
            fVar247 = fVar265 + fVar260;
            fVar259 = fVar266 + fVar263;
            fVar261 = fVar269 + fVar267;
            fVar123 = -fVar214 * fVar122 * auVar254._0_4_;
            fVar52 = -fVar215 * fVar97 * auVar254._4_4_;
            fVar91 = -fVar216 * fVar149 * auVar254._8_4_;
            fVar92 = -fVar217 * fVar112 * auVar254._12_4_;
            fVar131 = fVar270 + fVar123;
            fVar133 = fVar232 + fVar52;
            fVar173 = fVar235 + fVar91;
            fVar174 = fVar242 + fVar92;
            fVar209 = fVar122 * 0.0 * auVar254._0_4_;
            fVar213 = fVar97 * 0.0 * auVar254._4_4_;
            fVar215 = fVar149 * 0.0 * auVar254._8_4_;
            fVar217 = fVar112 * 0.0 * auVar254._12_4_;
            fVar97 = fVar203 - fVar176;
            fVar112 = fVar204 - fVar196;
            fVar122 = fVar234 - fVar199;
            fVar149 = fVar241 - fVar205;
            fVar231 = fVar114 + fVar209;
            fVar252 = fVar125 + fVar213;
            fVar256 = fVar132 + fVar215;
            fVar257 = fVar134 + fVar217;
            fVar208 = fVar245 - fVar110;
            fVar210 = fVar89 - fVar115;
            fVar214 = fVar95 - fVar148;
            fVar216 = fVar111 - fVar124;
            fVar135 = fVar53 - fVar218;
            fVar219 = fVar93 - fVar226;
            fVar227 = fVar98 - fVar228;
            fVar229 = fVar113 - fVar230;
            uVar46 = -(uint)(0.0 < (fVar208 * (fVar231 - fVar135) - fVar135 * (fVar131 - fVar208)) *
                                   0.0 + (fVar135 * (fVar244 - fVar97) -
                                         (fVar231 - fVar135) * fVar97) * 0.0 +
                                         ((fVar131 - fVar208) * fVar97 -
                                         (fVar244 - fVar97) * fVar208));
            uVar47 = -(uint)(0.0 < (fVar210 * (fVar252 - fVar219) - fVar219 * (fVar133 - fVar210)) *
                                   0.0 + (fVar219 * (fVar247 - fVar112) -
                                         (fVar252 - fVar219) * fVar112) * 0.0 +
                                         ((fVar133 - fVar210) * fVar112 -
                                         (fVar247 - fVar112) * fVar210));
            uVar48 = -(uint)(0.0 < (fVar214 * (fVar256 - fVar227) - fVar227 * (fVar173 - fVar214)) *
                                   0.0 + (fVar227 * (fVar259 - fVar122) -
                                         (fVar256 - fVar227) * fVar122) * 0.0 +
                                         ((fVar173 - fVar214) * fVar122 -
                                         (fVar259 - fVar122) * fVar214));
            uVar49 = -(uint)(0.0 < (fVar216 * (fVar257 - fVar229) - fVar229 * (fVar174 - fVar216)) *
                                   0.0 + (fVar229 * (fVar261 - fVar149) -
                                         (fVar257 - fVar229) * fVar149) * 0.0 +
                                         ((fVar174 - fVar216) * fVar149 -
                                         (fVar261 - fVar149) * fVar216));
            fVar176 = (float)((uint)(fVar262 - fVar258) & uVar46 |
                             ~uVar46 & (uint)(fVar203 + fVar176));
            fVar196 = (float)((uint)(fVar265 - fVar260) & uVar47 |
                             ~uVar47 & (uint)(fVar204 + fVar196));
            fVar199 = (float)((uint)(fVar266 - fVar263) & uVar48 |
                             ~uVar48 & (uint)(fVar234 + fVar199));
            fVar205 = (float)((uint)(fVar269 - fVar267) & uVar49 |
                             ~uVar49 & (uint)(fVar241 + fVar205));
            fVar270 = (float)((uint)(fVar270 - fVar123) & uVar46 |
                             ~uVar46 & (uint)(fVar245 + fVar110));
            fVar232 = (float)((uint)(fVar232 - fVar52) & uVar47 | ~uVar47 & (uint)(fVar89 + fVar115)
                             );
            fVar235 = (float)((uint)(fVar235 - fVar91) & uVar48 | ~uVar48 & (uint)(fVar95 + fVar148)
                             );
            fVar242 = (float)((uint)(fVar242 - fVar92) & uVar49 |
                             ~uVar49 & (uint)(fVar111 + fVar124));
            fVar218 = (float)((uint)(fVar114 - fVar209) & uVar46 |
                             ~uVar46 & (uint)(fVar53 + fVar218));
            fVar226 = (float)((uint)(fVar125 - fVar213) & uVar47 |
                             ~uVar47 & (uint)(fVar93 + fVar226));
            fVar228 = (float)((uint)(fVar132 - fVar215) & uVar48 |
                             ~uVar48 & (uint)(fVar98 + fVar228));
            fVar230 = (float)((uint)(fVar134 - fVar217) & uVar49 |
                             ~uVar49 & (uint)(fVar113 + fVar230));
            fVar110 = (float)((uint)fVar97 & uVar46 | ~uVar46 & (uint)fVar244);
            fVar115 = (float)((uint)fVar112 & uVar47 | ~uVar47 & (uint)fVar247);
            fVar148 = (float)((uint)fVar122 & uVar48 | ~uVar48 & (uint)fVar259);
            fVar124 = (float)((uint)fVar149 & uVar49 | ~uVar49 & (uint)fVar261);
            fVar209 = (float)((uint)fVar208 & uVar46 | ~uVar46 & (uint)fVar131);
            fVar213 = (float)((uint)fVar210 & uVar47 | ~uVar47 & (uint)fVar133);
            fVar215 = (float)((uint)fVar214 & uVar48 | ~uVar48 & (uint)fVar173);
            fVar217 = (float)((uint)fVar216 & uVar49 | ~uVar49 & (uint)fVar174);
            fVar262 = (float)((uint)fVar135 & uVar46 | ~uVar46 & (uint)fVar231);
            fVar265 = (float)((uint)fVar219 & uVar47 | ~uVar47 & (uint)fVar252);
            fVar266 = (float)((uint)fVar227 & uVar48 | ~uVar48 & (uint)fVar256);
            fVar269 = (float)((uint)fVar229 & uVar49 | ~uVar49 & (uint)fVar257);
            fVar203 = (float)((uint)fVar244 & uVar46 | ~uVar46 & (uint)fVar97) - fVar176;
            fVar204 = (float)((uint)fVar247 & uVar47 | ~uVar47 & (uint)fVar112) - fVar196;
            fVar234 = (float)((uint)fVar259 & uVar48 | ~uVar48 & (uint)fVar122) - fVar199;
            fVar241 = (float)((uint)fVar261 & uVar49 | ~uVar49 & (uint)fVar149) - fVar205;
            fVar131 = (float)((uint)fVar131 & uVar46 | ~uVar46 & (uint)fVar208) - fVar270;
            fVar133 = (float)((uint)fVar133 & uVar47 | ~uVar47 & (uint)fVar210) - fVar232;
            fVar173 = (float)((uint)fVar173 & uVar48 | ~uVar48 & (uint)fVar214) - fVar235;
            fVar174 = (float)((uint)fVar174 & uVar49 | ~uVar49 & (uint)fVar216) - fVar242;
            fVar208 = (float)((uint)fVar231 & uVar46 | ~uVar46 & (uint)fVar135) - fVar218;
            fVar210 = (float)((uint)fVar252 & uVar47 | ~uVar47 & (uint)fVar219) - fVar226;
            fVar214 = (float)((uint)fVar256 & uVar48 | ~uVar48 & (uint)fVar227) - fVar228;
            fVar216 = (float)((uint)fVar257 & uVar49 | ~uVar49 & (uint)fVar229) - fVar230;
            fVar245 = fVar176 - fVar110;
            fVar53 = fVar196 - fVar115;
            fVar89 = fVar199 - fVar148;
            fVar93 = fVar205 - fVar124;
            fVar123 = fVar270 - fVar209;
            fVar52 = fVar232 - fVar213;
            fVar91 = fVar235 - fVar215;
            fVar92 = fVar242 - fVar217;
            fVar97 = fVar218 - fVar262;
            fVar112 = fVar226 - fVar265;
            fVar122 = fVar228 - fVar266;
            fVar149 = fVar230 - fVar269;
            fVar244 = (fVar270 * fVar208 - fVar218 * fVar131) * 0.0 +
                      (fVar218 * fVar203 - fVar176 * fVar208) * 0.0 +
                      (fVar176 * fVar131 - fVar270 * fVar203);
            fVar247 = (fVar232 * fVar210 - fVar226 * fVar133) * 0.0 +
                      (fVar226 * fVar204 - fVar196 * fVar210) * 0.0 +
                      (fVar196 * fVar133 - fVar232 * fVar204);
            auVar129._4_4_ = fVar247;
            auVar129._0_4_ = fVar244;
            fVar259 = (fVar235 * fVar214 - fVar228 * fVar173) * 0.0 +
                      (fVar228 * fVar234 - fVar199 * fVar214) * 0.0 +
                      (fVar199 * fVar173 - fVar235 * fVar234);
            fVar261 = (fVar242 * fVar216 - fVar230 * fVar174) * 0.0 +
                      (fVar230 * fVar241 - fVar205 * fVar216) * 0.0 +
                      (fVar205 * fVar174 - fVar242 * fVar241);
            auVar255._0_4_ =
                 (fVar209 * fVar97 - fVar262 * fVar123) * 0.0 +
                 (fVar262 * fVar245 - fVar110 * fVar97) * 0.0 +
                 (fVar110 * fVar123 - fVar209 * fVar245);
            auVar255._4_4_ =
                 (fVar213 * fVar112 - fVar265 * fVar52) * 0.0 +
                 (fVar265 * fVar53 - fVar115 * fVar112) * 0.0 +
                 (fVar115 * fVar52 - fVar213 * fVar53);
            auVar255._8_4_ =
                 (fVar215 * fVar122 - fVar266 * fVar91) * 0.0 +
                 (fVar266 * fVar89 - fVar148 * fVar122) * 0.0 +
                 (fVar148 * fVar91 - fVar215 * fVar89);
            auVar255._12_4_ =
                 (fVar217 * fVar149 - fVar269 * fVar92) * 0.0 +
                 (fVar269 * fVar93 - fVar124 * fVar149) * 0.0 +
                 (fVar124 * fVar92 - fVar217 * fVar93);
            auVar129._8_4_ = fVar259;
            auVar129._12_4_ = fVar261;
            auVar64 = maxps(auVar129,auVar255);
            bVar32 = auVar64._0_4_ <= 0.0 && bVar32;
            auVar130._0_4_ = -(uint)bVar32;
            bVar33 = auVar64._4_4_ <= 0.0 && bVar33;
            auVar130._4_4_ = -(uint)bVar33;
            bVar31 = auVar64._8_4_ <= 0.0 && bVar31;
            auVar130._8_4_ = -(uint)bVar31;
            bVar30 = auVar64._12_4_ <= 0.0 && bVar30;
            auVar130._12_4_ = -(uint)bVar30;
            iVar34 = movmskps((int)puVar37,auVar130);
            if (iVar34 == 0) {
LAB_00b6b285:
              auVar121._8_8_ = uStack_390;
              auVar121._0_8_ = local_398;
            }
            else {
              fVar148 = fVar123 * fVar208 - fVar97 * fVar131;
              fVar124 = fVar52 * fVar210 - fVar112 * fVar133;
              fVar209 = fVar91 * fVar214 - fVar122 * fVar173;
              fVar213 = fVar92 * fVar216 - fVar149 * fVar174;
              fVar110 = fVar97 * fVar203 - fVar208 * fVar245;
              fVar112 = fVar112 * fVar204 - fVar210 * fVar53;
              fVar115 = fVar122 * fVar234 - fVar214 * fVar89;
              fVar122 = fVar149 * fVar241 - fVar216 * fVar93;
              fVar123 = fVar245 * fVar131 - fVar123 * fVar203;
              fVar149 = fVar53 * fVar133 - fVar52 * fVar204;
              fVar131 = fVar89 * fVar173 - fVar91 * fVar234;
              fVar133 = fVar93 * fVar174 - fVar92 * fVar241;
              auVar120._0_4_ = fVar110 * 0.0 + fVar123;
              auVar120._4_4_ = fVar112 * 0.0 + fVar149;
              auVar120._8_4_ = fVar115 * 0.0 + fVar131;
              auVar120._12_4_ = fVar122 * 0.0 + fVar133;
              auVar172._0_4_ = fVar148 * 0.0 + auVar120._0_4_;
              auVar172._4_4_ = fVar124 * 0.0 + auVar120._4_4_;
              auVar172._8_4_ = fVar209 * 0.0 + auVar120._8_4_;
              auVar172._12_4_ = fVar213 * 0.0 + auVar120._12_4_;
              auVar64 = rcpps(auVar120,auVar172);
              fVar52 = auVar64._0_4_;
              fVar91 = auVar64._4_4_;
              fVar92 = auVar64._8_4_;
              fVar97 = auVar64._12_4_;
              fVar52 = (1.0 - auVar172._0_4_ * fVar52) * fVar52 + fVar52;
              fVar91 = (1.0 - auVar172._4_4_ * fVar91) * fVar91 + fVar91;
              fVar92 = (1.0 - auVar172._8_4_ * fVar92) * fVar92 + fVar92;
              fVar97 = (1.0 - auVar172._12_4_ * fVar97) * fVar97 + fVar97;
              fVar110 = (fVar218 * fVar123 + fVar270 * fVar110 + fVar176 * fVar148) * fVar52;
              fVar112 = (fVar226 * fVar149 + fVar232 * fVar112 + fVar196 * fVar124) * fVar91;
              fVar115 = (fVar228 * fVar131 + fVar235 * fVar115 + fVar199 * fVar209) * fVar92;
              fVar122 = (fVar230 * fVar133 + fVar242 * fVar122 + fVar205 * fVar213) * fVar97;
              fVar123 = *(float *)(ray + k * 4 + 0x80);
              bVar32 = ((float)local_2b8._0_4_ <= fVar110 && fVar110 <= fVar123) && bVar32;
              auVar146._0_4_ = -(uint)bVar32;
              bVar33 = ((float)local_2b8._4_4_ <= fVar112 && fVar112 <= fVar123) && bVar33;
              auVar146._4_4_ = -(uint)bVar33;
              bVar31 = (fStack_2b0 <= fVar115 && fVar115 <= fVar123) && bVar31;
              auVar146._8_4_ = -(uint)bVar31;
              bVar30 = (fStack_2ac <= fVar122 && fVar122 <= fVar123) && bVar30;
              auVar146._12_4_ = -(uint)bVar30;
              iVar34 = movmskps(iVar34,auVar146);
              if (iVar34 == 0) goto LAB_00b6b285;
              auVar147._0_8_ =
                   CONCAT44(-(uint)(auVar172._4_4_ != 0.0 && bVar33),
                            -(uint)(auVar172._0_4_ != 0.0 && bVar32));
              auVar147._8_4_ = -(uint)(auVar172._8_4_ != 0.0 && bVar31);
              auVar147._12_4_ = -(uint)(auVar172._12_4_ != 0.0 && bVar30);
              iVar34 = movmskps(iVar34,auVar147);
              auVar121._8_8_ = uStack_390;
              auVar121._0_8_ = local_398;
              if (iVar34 != 0) {
                fVar244 = fVar244 * fVar52;
                fVar247 = fVar247 * fVar91;
                fVar259 = fVar259 * fVar92;
                fVar261 = fVar261 * fVar97;
                local_178 = (float)((uint)(1.0 - fVar244) & uVar46 | ~uVar46 & (uint)fVar244);
                fStack_174 = (float)((uint)(1.0 - fVar247) & uVar47 | ~uVar47 & (uint)fVar247);
                fStack_170 = (float)((uint)(1.0 - fVar259) & uVar48 | ~uVar48 & (uint)fVar259);
                fStack_16c = (float)((uint)(1.0 - fVar261) & uVar49 | ~uVar49 & (uint)fVar261);
                local_298 = (float)(~uVar46 & (uint)(auVar255._0_4_ * fVar52) |
                                   (uint)(1.0 - auVar255._0_4_ * fVar52) & uVar46);
                fStack_294 = (float)(~uVar47 & (uint)(auVar255._4_4_ * fVar91) |
                                    (uint)(1.0 - auVar255._4_4_ * fVar91) & uVar47);
                fStack_290 = (float)(~uVar48 & (uint)(auVar255._8_4_ * fVar92) |
                                    (uint)(1.0 - auVar255._8_4_ * fVar92) & uVar48);
                fStack_28c = (float)(~uVar49 & (uint)(auVar255._12_4_ * fVar97) |
                                    (uint)(1.0 - auVar255._12_4_ * fVar97) & uVar49);
                auVar121._8_4_ = auVar147._8_4_;
                auVar121._0_8_ = auVar147._0_8_;
                auVar121._12_4_ = auVar147._12_4_;
                local_188 = fVar110;
                fStack_184 = fVar112;
                fStack_180 = fVar115;
                fStack_17c = fVar122;
              }
            }
            uStack_1d0 = CONCAT44(fStack_37c,fStack_380);
            uStack_1e0 = CONCAT44(fStack_36c,fStack_370);
            uStack_1f0 = CONCAT44(fStack_33c,fStack_340);
            local_1f8 = CONCAT44(fStack_344,local_348);
            local_1e8._4_4_ = fStack_374;
            local_1e8._0_4_ = local_378;
            local_1d8._4_4_ = fStack_384;
            local_1d8._0_4_ = local_388;
            iVar34 = movmskps(iVar34,auVar121);
            local_2c8 = auVar195;
            if (iVar34 == 0) {
              uVar46 = 0;
LAB_00b6b248:
              puVar37 = (undefined1 *)(ulong)uVar46;
              fVar123 = local_368;
              fVar52 = fStack_364;
              fVar91 = fStack_360;
              fVar92 = fStack_35c;
              goto LAB_00b6b24d;
            }
            fVar52 = (auVar254._0_4_ - auVar238._0_4_) * local_178 + auVar238._0_4_;
            fVar91 = (auVar254._4_4_ - auVar238._4_4_) * fStack_174 + auVar238._4_4_;
            fVar92 = (auVar254._8_4_ - auVar238._8_4_) * fStack_170 + auVar238._8_4_;
            fVar97 = (auVar254._12_4_ - auVar238._12_4_) * fStack_16c + auVar238._12_4_;
            fVar123 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            local_1c8._0_4_ = -(uint)(fVar123 * (fVar52 + fVar52) < local_188) & auVar121._0_4_;
            local_1c8._4_4_ = -(uint)(fVar123 * (fVar91 + fVar91) < fStack_184) & auVar121._4_4_;
            local_1c8._8_4_ = -(uint)(fVar123 * (fVar92 + fVar92) < fStack_180) & auVar121._8_4_;
            local_1c8._12_4_ = -(uint)(fVar123 * (fVar97 + fVar97) < fStack_17c) & auVar121._12_4_;
            uVar46 = movmskps(iVar34,local_1c8);
            if (uVar46 == 0) goto LAB_00b6b248;
            local_298 = local_298 + local_298 + -1.0;
            fStack_294 = fStack_294 + fStack_294 + -1.0;
            fStack_290 = fStack_290 + fStack_290 + -1.0;
            fStack_28c = fStack_28c + fStack_28c + -1.0;
            local_248 = local_178;
            fStack_244 = fStack_174;
            fStack_240 = fStack_170;
            fStack_23c = fStack_16c;
            local_228._4_4_ = fStack_184;
            local_228._0_4_ = local_188;
            fStack_220 = fStack_180;
            fStack_21c = fStack_17c;
            local_208 = CONCAT44(fStack_334,local_338);
            uStack_200 = CONCAT44(fStack_32c,fStack_330);
            pGVar40 = (context->scene->geometries).items[local_3a0].ptr;
            if ((pGVar40->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar38 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar38 = 1, pGVar40->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar123 = (float)(int)local_218;
              local_1b8[0] = (fVar123 + local_178 + 0.0) * local_b8;
              local_1b8[1] = (fVar123 + fStack_174 + 1.0) * fStack_b4;
              local_1b8[2] = (fVar123 + fStack_170 + 2.0) * fStack_b0;
              local_1b8[3] = (fVar123 + fStack_16c + 3.0) * fStack_ac;
              local_1a8 = CONCAT44(fStack_294,local_298);
              uStack_1a0 = CONCAT44(fStack_28c,fStack_290);
              local_198._4_4_ = fStack_184;
              local_198._0_4_ = local_188;
              local_198._12_4_ = fStack_17c;
              local_198._8_4_ = fStack_180;
              uVar42 = (ulong)(byte)uVar46;
              uVar43 = 0;
              if (uVar42 != 0) {
                for (; ((byte)uVar46 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar151 = *local_310;
              uVar166 = local_310[1];
              stack0xfffffffffffffbdc = auVar238._4_12_;
              local_428._0_4_ = 1;
              local_238 = local_298;
              fStack_234 = fStack_294;
              fStack_230 = fStack_290;
              fStack_22c = fStack_28c;
              local_214 = iVar7;
              do {
                local_118 = local_1b8[uVar43];
                uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_108 = *(undefined4 *)((long)&local_1a8 + uVar43 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + uVar43 * 4);
                fVar97 = 1.0 - local_118;
                fVar123 = local_118 * 3.0;
                fVar92 = ((fVar123 + 2.0) * (fVar97 + fVar97) + fVar97 * -3.0 * fVar97) * 0.5;
                fVar52 = (local_118 * local_118 + fVar97 * -2.0 * local_118) * 0.5;
                fVar91 = (local_118 * fVar123 + (fVar123 + -5.0) * (local_118 + local_118)) * 0.5;
                local_308.context = context->user;
                fVar123 = (local_118 * (fVar97 + fVar97) - fVar97 * fVar97) * 0.5;
                local_148 = fVar123 * local_338 +
                            fVar91 * fVar198 + fVar92 * fVar246 + fVar52 * fVar233;
                local_138 = fVar123 * fStack_334 +
                            fVar91 * fVar200 + fVar92 * fVar177 + fVar52 * fVar240;
                local_128 = fVar123 * fStack_330 +
                            fVar91 * fVar201 + fVar92 * fVar197 + fVar52 * fVar243;
                fStack_144 = local_148;
                fStack_140 = local_148;
                fStack_13c = local_148;
                fStack_134 = local_138;
                fStack_130 = local_138;
                fStack_12c = local_138;
                fStack_124 = local_128;
                fStack_120 = local_128;
                fStack_11c = local_128;
                fStack_114 = local_118;
                fStack_110 = local_118;
                fStack_10c = local_118;
                uStack_104 = local_108;
                uStack_100 = local_108;
                uStack_fc = local_108;
                local_f8 = CONCAT44(uStack_a4,local_a8);
                uStack_f0 = CONCAT44(uStack_9c,uStack_a0);
                local_e8 = CONCAT44(uStack_94,local_98);
                uStack_e0 = CONCAT44(uStack_8c,uStack_90);
                local_d8 = (local_308.context)->instID[0];
                uStack_d4 = local_d8;
                uStack_d0 = local_d8;
                uStack_cc = local_d8;
                local_c8 = (local_308.context)->instPrimID[0];
                uStack_c4 = local_c8;
                uStack_c0 = local_c8;
                uStack_bc = local_c8;
                local_308.valid = (int *)&local_3b8;
                local_308.geometryUserPtr = pGVar40->userPtr;
                local_308.hit = (RTCHitN *)&local_148;
                local_308.N = 4;
                p_Var35 = pGVar40->occlusionFilterN;
                local_3b8 = uVar151;
                uStack_3b0 = uVar166;
                local_308.ray = (RTCRayN *)ray;
                if (p_Var35 != (RTCFilterFunctionN)0x0) {
                  p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_308);
                }
                auVar83._0_4_ = -(uint)((int)local_3b8 == 0);
                auVar83._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                auVar83._8_4_ = -(uint)((int)uStack_3b0 == 0);
                auVar83._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                uVar46 = movmskps((int)p_Var35,auVar83);
                pRVar36 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                if ((uVar46 ^ 0xf) == 0) {
                  auVar83 = auVar83 ^ _DAT_01febe20;
                }
                else {
                  p_Var35 = context->args->filter;
                  if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar40->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var35)(&local_308);
                  }
                  auVar109._0_4_ = -(uint)((int)local_3b8 == 0);
                  auVar109._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                  auVar109._8_4_ = -(uint)((int)uStack_3b0 == 0);
                  auVar109._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                  auVar83 = auVar109 ^ _DAT_01febe20;
                  *(undefined1 (*) [16])(local_308.ray + 0x80) =
                       ~auVar109 & _DAT_01feba00 |
                       *(undefined1 (*) [16])(local_308.ray + 0x80) & auVar109;
                  pRVar36 = local_308.ray;
                }
                auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                uVar46 = movmskps((int)pRVar36,auVar84);
                if (uVar46 != 0) break;
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
                uVar42 = uVar42 ^ 1L << (uVar43 & 0x3f);
                uVar43 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar46 = CONCAT31(0,uVar42 != 0);
                local_428._0_4_ = uVar46;
              } while (uVar42 != 0);
              bVar38 = local_428[0];
            }
            bVar45 = (bool)(bVar45 | bVar38);
            fVar123 = local_368;
            fVar52 = fStack_364;
            fVar91 = fStack_360;
            fVar92 = fStack_35c;
          }
          lVar41 = lVar41 + 4;
        } while ((int)lVar41 < iVar7);
      }
      if (bVar45 != false) {
        return local_509;
      }
      fVar123 = *(float *)(ray + k * 4 + 0x80);
      auVar108._4_4_ = -(uint)(fStack_44 <= fVar123);
      auVar108._0_4_ = -(uint)(local_48 <= fVar123);
      auVar108._8_4_ = -(uint)(fStack_40 <= fVar123);
      auVar108._12_4_ = -(uint)(fStack_3c <= fVar123);
      uVar46 = movmskps(uVar46,auVar108);
      uVar46 = (uint)uVar44 & uVar46;
      local_509 = uVar46 != 0;
    } while (local_509);
  }
  return local_509;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }